

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  long lVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined3 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined8 uVar19;
  undefined6 uVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  byte bVar36;
  ulong uVar37;
  RayHitK<4> *pRVar39;
  RTCFilterFunctionN p_Var40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  uint uVar49;
  short sVar50;
  float fVar51;
  float fVar52;
  float fVar92;
  float fVar94;
  vfloat_impl<4> p00;
  undefined2 uVar91;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  float fVar93;
  float fVar95;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar96;
  float fVar116;
  float fVar117;
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float t1;
  float fVar118;
  float fVar129;
  float fVar130;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar131;
  float fVar135;
  float fVar136;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar150;
  float fVar151;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar170;
  float fVar171;
  vfloat4 a;
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar172;
  float fVar176;
  float fVar177;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar178;
  float fVar201;
  float fVar202;
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar203;
  float fVar214;
  float fVar215;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar216;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar246;
  float fVar249;
  vfloat4 a_1;
  undefined1 auVar238 [16];
  float fVar252;
  undefined1 auVar241 [16];
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar251;
  float fVar253;
  float fVar254;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar255;
  float fVar256;
  float fVar261;
  float fVar263;
  float fVar265;
  undefined1 auVar257 [16];
  float fVar262;
  float fVar264;
  float fVar266;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar267;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar273;
  float fVar277;
  float fVar278;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar280;
  float fVar281;
  undefined1 auVar279 [16];
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined8 local_508;
  undefined1 local_428 [16];
  undefined1 (*local_418) [16];
  Primitive *local_410;
  ulong local_408;
  ulong local_400;
  RTCFilterFunctionNArguments local_3f8;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined8 local_338;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  undefined8 uStack_320;
  uint auStack_318 [4];
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  ulong uVar38;
  undefined1 auVar87 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 uVar90;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  
  PVar5 = prim[1];
  uVar37 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar37 * 0x19 + 6;
  fVar130 = *(float *)(pPVar4 + 0xc);
  fVar131 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar130;
  fVar135 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar130;
  fVar136 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar130;
  fVar118 = *(float *)(ray + k * 4 + 0x40) * fVar130;
  fVar129 = *(float *)(ray + k * 4 + 0x50) * fVar130;
  fVar130 = *(float *)(ray + k * 4 + 0x60) * fVar130;
  uVar6 = *(undefined4 *)(prim + uVar37 * 4 + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar159._8_4_ = 0;
  auVar159._0_8_ = uVar38;
  auVar159._12_2_ = uVar91;
  auVar159._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._8_2_ = 0;
  auVar158._0_8_ = uVar38;
  auVar158._10_2_ = uVar91;
  auVar60._10_6_ = auVar158._10_6_;
  auVar60._8_2_ = uVar91;
  auVar60._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar21._4_8_ = auVar60._8_8_;
  auVar21._2_2_ = uVar91;
  auVar21._0_2_ = uVar91;
  fVar96 = (float)((int)sVar50 >> 8);
  fVar116 = (float)(auVar21._0_4_ >> 0x18);
  fVar117 = (float)(auVar60._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar37 * 5 + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar53._8_4_ = 0;
  auVar53._0_8_ = uVar38;
  auVar53._12_2_ = uVar91;
  auVar53._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar218._12_4_ = auVar53._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar38;
  auVar218._10_2_ = uVar91;
  auVar122._10_6_ = auVar218._10_6_;
  auVar122._8_2_ = uVar91;
  auVar122._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar22._4_8_ = auVar122._8_8_;
  auVar22._2_2_ = uVar91;
  auVar22._0_2_ = uVar91;
  fVar137 = (float)((int)sVar50 >> 8);
  fVar150 = (float)(auVar22._0_4_ >> 0x18);
  fVar151 = (float)(auVar122._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar37 * 6 + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar38;
  auVar56._12_2_ = uVar91;
  auVar56._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._8_2_ = 0;
  auVar55._0_8_ = uVar38;
  auVar55._10_2_ = uVar91;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._8_2_ = uVar91;
  auVar54._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar23._4_8_ = auVar54._8_8_;
  auVar23._2_2_ = uVar91;
  auVar23._0_2_ = uVar91;
  fVar172 = (float)((int)sVar50 >> 8);
  fVar176 = (float)(auVar23._0_4_ >> 0x18);
  fVar177 = (float)(auVar54._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar37 * 0xb + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar38;
  auVar59._12_2_ = uVar91;
  auVar59._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar38;
  auVar58._10_2_ = uVar91;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar91;
  auVar57._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar24._4_8_ = auVar57._8_8_;
  auVar24._2_2_ = uVar91;
  auVar24._0_2_ = uVar91;
  fVar51 = (float)((int)sVar50 >> 8);
  fVar92 = (float)(auVar24._0_4_ >> 0x18);
  fVar94 = (float)(auVar57._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar38;
  auVar155._12_2_ = uVar91;
  auVar155._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar38;
  auVar154._10_2_ = uVar91;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar91;
  auVar153._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar25._4_8_ = auVar153._8_8_;
  auVar25._2_2_ = uVar91;
  auVar25._0_2_ = uVar91;
  fVar152 = (float)((int)sVar50 >> 8);
  fVar170 = (float)(auVar25._0_4_ >> 0x18);
  fVar171 = (float)(auVar153._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar37 + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar38;
  auVar181._12_2_ = uVar91;
  auVar181._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar38;
  auVar180._10_2_ = uVar91;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar91;
  auVar179._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar26._4_8_ = auVar179._8_8_;
  auVar26._2_2_ = uVar91;
  auVar26._0_2_ = uVar91;
  fVar216 = (float)((int)sVar50 >> 8);
  fVar224 = (float)(auVar26._0_4_ >> 0x18);
  fVar225 = (float)(auVar179._8_4_ >> 0x18);
  uVar42 = (ulong)(uint)((int)(uVar37 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar42 + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar38;
  auVar184._12_2_ = uVar91;
  auVar184._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar38;
  auVar183._10_2_ = uVar91;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar91;
  auVar182._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar27._4_8_ = auVar182._8_8_;
  auVar27._2_2_ = uVar91;
  auVar27._0_2_ = uVar91;
  fVar203 = (float)((int)sVar50 >> 8);
  fVar214 = (float)(auVar27._0_4_ >> 0x18);
  fVar215 = (float)(auVar182._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 + uVar37 + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar38;
  auVar187._12_2_ = uVar91;
  auVar187._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar38;
  auVar186._10_2_ = uVar91;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar91;
  auVar185._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar28._4_8_ = auVar185._8_8_;
  auVar28._2_2_ = uVar91;
  auVar28._0_2_ = uVar91;
  fVar226 = (float)((int)sVar50 >> 8);
  fVar232 = (float)(auVar28._0_4_ >> 0x18);
  fVar233 = (float)(auVar185._8_4_ >> 0x18);
  uVar41 = (ulong)(uint)((int)(uVar37 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar41 + 6);
  uVar90 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar90,uVar90);
  uVar90 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar91,uVar90),CONCAT14(uVar90,uVar6));
  uVar90 = (undefined1)((uint)uVar6 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar90),uVar90);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar38 = CONCAT62(uVar20,sVar50);
  auVar240._8_4_ = 0;
  auVar240._0_8_ = uVar38;
  auVar240._12_2_ = uVar91;
  auVar240._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar38;
  auVar239._10_2_ = uVar91;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._8_2_ = uVar91;
  auVar238._0_8_ = uVar38;
  uVar91 = (undefined2)uVar20;
  auVar29._4_8_ = auVar238._8_8_;
  auVar29._2_2_ = uVar91;
  auVar29._0_2_ = uVar91;
  fVar52 = (float)((int)sVar50 >> 8);
  fVar93 = (float)(auVar29._0_4_ >> 0x18);
  fVar95 = (float)(auVar238._8_4_ >> 0x18);
  fVar255 = fVar118 * fVar96 + fVar129 * fVar137 + fVar130 * fVar172;
  fVar261 = fVar118 * fVar116 + fVar129 * fVar150 + fVar130 * fVar176;
  fVar263 = fVar118 * fVar117 + fVar129 * fVar151 + fVar130 * fVar177;
  fVar265 = fVar118 * (float)(auVar158._12_4_ >> 0x18) +
            fVar129 * (float)(auVar218._12_4_ >> 0x18) + fVar130 * (float)(auVar55._12_4_ >> 0x18);
  fVar235 = fVar118 * fVar51 + fVar129 * fVar152 + fVar130 * fVar216;
  fVar246 = fVar118 * fVar92 + fVar129 * fVar170 + fVar130 * fVar224;
  fVar249 = fVar118 * fVar94 + fVar129 * fVar171 + fVar130 * fVar225;
  fVar252 = fVar118 * (float)(auVar58._12_4_ >> 0x18) +
            fVar129 * (float)(auVar154._12_4_ >> 0x18) + fVar130 * (float)(auVar180._12_4_ >> 0x18);
  fVar178 = fVar118 * fVar203 + fVar129 * fVar226 + fVar130 * fVar52;
  fVar201 = fVar118 * fVar214 + fVar129 * fVar232 + fVar130 * fVar93;
  fVar202 = fVar118 * fVar215 + fVar129 * fVar233 + fVar130 * fVar95;
  fVar118 = fVar118 * (float)(auVar183._12_4_ >> 0x18) +
            fVar129 * (float)(auVar186._12_4_ >> 0x18) + fVar130 * (float)(auVar239._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar137 = fVar96 * fVar131 + fVar137 * fVar135 + fVar172 * fVar136;
  fVar150 = fVar116 * fVar131 + fVar150 * fVar135 + fVar176 * fVar136;
  fVar151 = fVar117 * fVar131 + fVar151 * fVar135 + fVar177 * fVar136;
  fVar172 = (float)(auVar158._12_4_ >> 0x18) * fVar131 +
            (float)(auVar218._12_4_ >> 0x18) * fVar135 + (float)(auVar55._12_4_ >> 0x18) * fVar136;
  fVar176 = fVar51 * fVar131 + fVar152 * fVar135 + fVar216 * fVar136;
  fVar177 = fVar92 * fVar131 + fVar170 * fVar135 + fVar224 * fVar136;
  fVar216 = fVar94 * fVar131 + fVar171 * fVar135 + fVar225 * fVar136;
  fVar224 = (float)(auVar58._12_4_ >> 0x18) * fVar131 +
            (float)(auVar154._12_4_ >> 0x18) * fVar135 + (float)(auVar180._12_4_ >> 0x18) * fVar136;
  fVar152 = fVar131 * fVar203 + fVar135 * fVar226 + fVar136 * fVar52;
  fVar170 = fVar131 * fVar214 + fVar135 * fVar232 + fVar136 * fVar93;
  fVar171 = fVar131 * fVar215 + fVar135 * fVar233 + fVar136 * fVar95;
  fVar131 = fVar131 * (float)(auVar183._12_4_ >> 0x18) +
            fVar135 * (float)(auVar186._12_4_ >> 0x18) + fVar136 * (float)(auVar239._12_4_ >> 0x18);
  fVar130 = (float)DAT_01f80d30;
  fVar51 = DAT_01f80d30._4_4_;
  fVar52 = DAT_01f80d30._8_4_;
  fVar92 = DAT_01f80d30._12_4_;
  uVar44 = -(uint)(fVar130 <= ABS(fVar255));
  uVar46 = -(uint)(fVar51 <= ABS(fVar261));
  uVar48 = -(uint)(fVar52 <= ABS(fVar263));
  uVar49 = -(uint)(fVar92 <= ABS(fVar265));
  auVar257._0_4_ = (uint)fVar255 & uVar44;
  auVar257._4_4_ = (uint)fVar261 & uVar46;
  auVar257._8_4_ = (uint)fVar263 & uVar48;
  auVar257._12_4_ = (uint)fVar265 & uVar49;
  auVar138._0_4_ = ~uVar44 & (uint)fVar130;
  auVar138._4_4_ = ~uVar46 & (uint)fVar51;
  auVar138._8_4_ = ~uVar48 & (uint)fVar52;
  auVar138._12_4_ = ~uVar49 & (uint)fVar92;
  auVar138 = auVar138 | auVar257;
  uVar44 = -(uint)(fVar130 <= ABS(fVar235));
  uVar46 = -(uint)(fVar51 <= ABS(fVar246));
  uVar48 = -(uint)(fVar52 <= ABS(fVar249));
  uVar49 = -(uint)(fVar92 <= ABS(fVar252));
  auVar241._0_4_ = (uint)fVar235 & uVar44;
  auVar241._4_4_ = (uint)fVar246 & uVar46;
  auVar241._8_4_ = (uint)fVar249 & uVar48;
  auVar241._12_4_ = (uint)fVar252 & uVar49;
  auVar156._0_4_ = ~uVar44 & (uint)fVar130;
  auVar156._4_4_ = ~uVar46 & (uint)fVar51;
  auVar156._8_4_ = ~uVar48 & (uint)fVar52;
  auVar156._12_4_ = ~uVar49 & (uint)fVar92;
  auVar156 = auVar156 | auVar241;
  uVar44 = -(uint)(fVar130 <= ABS(fVar178));
  uVar46 = -(uint)(fVar51 <= ABS(fVar201));
  uVar48 = -(uint)(fVar52 <= ABS(fVar202));
  uVar49 = -(uint)(fVar92 <= ABS(fVar118));
  auVar188._0_4_ = (uint)fVar178 & uVar44;
  auVar188._4_4_ = (uint)fVar201 & uVar46;
  auVar188._8_4_ = (uint)fVar202 & uVar48;
  auVar188._12_4_ = (uint)fVar118 & uVar49;
  auVar173._0_4_ = ~uVar44 & (uint)fVar130;
  auVar173._4_4_ = ~uVar46 & (uint)fVar51;
  auVar173._8_4_ = ~uVar48 & (uint)fVar52;
  auVar173._12_4_ = ~uVar49 & (uint)fVar92;
  auVar173 = auVar173 | auVar188;
  auVar60 = rcpps(_DAT_01f80d30,auVar138);
  fVar130 = auVar60._0_4_;
  fVar92 = auVar60._4_4_;
  fVar95 = auVar60._8_4_;
  fVar117 = auVar60._12_4_;
  fVar130 = (1.0 - auVar138._0_4_ * fVar130) * fVar130 + fVar130;
  fVar92 = (1.0 - auVar138._4_4_ * fVar92) * fVar92 + fVar92;
  fVar95 = (1.0 - auVar138._8_4_ * fVar95) * fVar95 + fVar95;
  fVar117 = (1.0 - auVar138._12_4_ * fVar117) * fVar117 + fVar117;
  auVar60 = rcpps(auVar60,auVar156);
  fVar51 = auVar60._0_4_;
  fVar93 = auVar60._4_4_;
  fVar96 = auVar60._8_4_;
  fVar118 = auVar60._12_4_;
  fVar51 = (1.0 - auVar156._0_4_ * fVar51) * fVar51 + fVar51;
  fVar93 = (1.0 - auVar156._4_4_ * fVar93) * fVar93 + fVar93;
  fVar96 = (1.0 - auVar156._8_4_ * fVar96) * fVar96 + fVar96;
  fVar118 = (1.0 - auVar156._12_4_ * fVar118) * fVar118 + fVar118;
  auVar60 = rcpps(auVar60,auVar173);
  fVar52 = auVar60._0_4_;
  fVar94 = auVar60._4_4_;
  fVar116 = auVar60._8_4_;
  fVar129 = auVar60._12_4_;
  fVar52 = (1.0 - auVar173._0_4_ * fVar52) * fVar52 + fVar52;
  fVar94 = (1.0 - auVar173._4_4_ * fVar94) * fVar94 + fVar94;
  fVar116 = (1.0 - auVar173._8_4_ * fVar116) * fVar116 + fVar116;
  fVar129 = (1.0 - auVar173._12_4_ * fVar129) * fVar129 + fVar129;
  uVar38 = *(ulong *)(prim + uVar37 * 7 + 6);
  uVar91 = (undefined2)(uVar38 >> 0x30);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar38;
  auVar63._12_2_ = uVar91;
  auVar63._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar38 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar38;
  auVar62._10_2_ = uVar91;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar91;
  auVar61._0_8_ = uVar38;
  uVar91 = (undefined2)(uVar38 >> 0x10);
  auVar30._4_8_ = auVar61._8_8_;
  auVar30._2_2_ = uVar91;
  auVar30._0_2_ = uVar91;
  auVar139._0_8_ =
       CONCAT44(((float)(auVar30._0_4_ >> 0x10) - fVar150) * fVar92,
                ((float)(int)(short)uVar38 - fVar137) * fVar130);
  auVar139._8_4_ = ((float)(auVar61._8_4_ >> 0x10) - fVar151) * fVar95;
  auVar139._12_4_ = ((float)(auVar62._12_4_ >> 0x10) - fVar172) * fVar117;
  uVar38 = *(ulong *)(prim + uVar37 * 9 + 6);
  uVar91 = (undefined2)(uVar38 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar38;
  auVar66._12_2_ = uVar91;
  auVar66._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar38 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar38;
  auVar65._10_2_ = uVar91;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar91;
  auVar64._0_8_ = uVar38;
  uVar91 = (undefined2)(uVar38 >> 0x10);
  auVar31._4_8_ = auVar64._8_8_;
  auVar31._2_2_ = uVar91;
  auVar31._0_2_ = uVar91;
  auVar174._0_4_ = ((float)(int)(short)uVar38 - fVar137) * fVar130;
  auVar174._4_4_ = ((float)(auVar31._0_4_ >> 0x10) - fVar150) * fVar92;
  auVar174._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar151) * fVar95;
  auVar174._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar172) * fVar117;
  uVar38 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar37 * -2 + 6);
  uVar91 = (undefined2)(uVar42 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar42;
  auVar99._12_2_ = uVar91;
  auVar99._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar42 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar42;
  auVar98._10_2_ = uVar91;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar91;
  auVar97._0_8_ = uVar42;
  uVar91 = (undefined2)(uVar42 >> 0x10);
  auVar32._4_8_ = auVar97._8_8_;
  auVar32._2_2_ = uVar91;
  auVar32._0_2_ = uVar91;
  auVar100._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar177) * fVar93,
                ((float)(int)(short)uVar42 - fVar176) * fVar51);
  auVar100._8_4_ = ((float)(auVar97._8_4_ >> 0x10) - fVar216) * fVar96;
  auVar100._12_4_ = ((float)(auVar98._12_4_ >> 0x10) - fVar224) * fVar118;
  uVar91 = (undefined2)(uVar38 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar38;
  auVar69._12_2_ = uVar91;
  auVar69._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar38 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar38;
  auVar68._10_2_ = uVar91;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar91;
  auVar67._0_8_ = uVar38;
  uVar91 = (undefined2)(uVar38 >> 0x10);
  auVar33._4_8_ = auVar67._8_8_;
  auVar33._2_2_ = uVar91;
  auVar33._0_2_ = uVar91;
  auVar204._0_4_ = ((float)(int)(short)uVar38 - fVar176) * fVar51;
  auVar204._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar177) * fVar93;
  auVar204._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar216) * fVar96;
  auVar204._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar224) * fVar118;
  uVar38 = *(ulong *)(prim + uVar41 + uVar37 + 6);
  uVar91 = (undefined2)(uVar38 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar38;
  auVar72._12_2_ = uVar91;
  auVar72._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar38 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar38;
  auVar71._10_2_ = uVar91;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar91;
  auVar70._0_8_ = uVar38;
  uVar91 = (undefined2)(uVar38 >> 0x10);
  auVar34._4_8_ = auVar70._8_8_;
  auVar34._2_2_ = uVar91;
  auVar34._0_2_ = uVar91;
  auVar73._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar170) * fVar94,
                ((float)(int)(short)uVar38 - fVar152) * fVar52);
  auVar73._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar171) * fVar116;
  auVar73._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar131) * fVar129;
  uVar38 = *(ulong *)(prim + uVar37 * 0x17 + 6);
  uVar91 = (undefined2)(uVar38 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar38;
  auVar191._12_2_ = uVar91;
  auVar191._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar38 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar38;
  auVar190._10_2_ = uVar91;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar91;
  auVar189._0_8_ = uVar38;
  uVar91 = (undefined2)(uVar38 >> 0x10);
  auVar35._4_8_ = auVar189._8_8_;
  auVar35._2_2_ = uVar91;
  auVar35._0_2_ = uVar91;
  auVar192._0_4_ = ((float)(int)(short)uVar38 - fVar152) * fVar52;
  auVar192._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar170) * fVar94;
  auVar192._8_4_ = ((float)(auVar189._8_4_ >> 0x10) - fVar171) * fVar116;
  auVar192._12_4_ = ((float)(auVar190._12_4_ >> 0x10) - fVar131) * fVar129;
  auVar157._8_4_ = auVar139._8_4_;
  auVar157._0_8_ = auVar139._0_8_;
  auVar157._12_4_ = auVar139._12_4_;
  auVar158 = minps(auVar157,auVar174);
  auVar119._8_4_ = auVar100._8_4_;
  auVar119._0_8_ = auVar100._0_8_;
  auVar119._12_4_ = auVar100._12_4_;
  auVar60 = minps(auVar119,auVar204);
  auVar158 = maxps(auVar158,auVar60);
  auVar120._8_4_ = auVar73._8_4_;
  auVar120._0_8_ = auVar73._0_8_;
  auVar120._12_4_ = auVar73._12_4_;
  auVar60 = minps(auVar120,auVar192);
  auVar132._4_4_ = uVar6;
  auVar132._0_4_ = uVar6;
  auVar132._8_4_ = uVar6;
  auVar132._12_4_ = uVar6;
  auVar60 = maxps(auVar60,auVar132);
  auVar159 = maxps(auVar158,auVar60);
  auVar158 = maxps(auVar139,auVar174);
  auVar60 = maxps(auVar100,auVar204);
  auVar158 = minps(auVar158,auVar60);
  local_2e8 = auVar159._0_4_ * 0.99999964;
  fStack_2e4 = auVar159._4_4_ * 0.99999964;
  fStack_2e0 = auVar159._8_4_ * 0.99999964;
  fStack_2dc = auVar159._12_4_ * 0.99999964;
  auVar60 = maxps(auVar73,auVar192);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar101._4_4_ = uVar6;
  auVar101._0_4_ = uVar6;
  auVar101._8_4_ = uVar6;
  auVar101._12_4_ = uVar6;
  auVar60 = minps(auVar60,auVar101);
  auVar60 = minps(auVar158,auVar60);
  auVar102._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_2e8 <= auVar60._0_4_ * 1.0000004);
  auVar102._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_2e4 <= auVar60._4_4_ * 1.0000004);
  auVar102._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_2e0 <= auVar60._8_4_ * 1.0000004);
  auVar102._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_2dc <= auVar60._12_4_ * 1.0000004);
  uVar44 = movmskps((uint)(byte)PVar5,auVar102);
  if (uVar44 == 0) {
    return;
  }
  uVar44 = uVar44 & 0xff;
  local_418 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_288._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_288._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_288._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_288._12_4_ = 0;
  local_410 = prim;
LAB_00a7270f:
  lVar10 = 0;
  if ((ulong)uVar44 != 0) {
    for (; (uVar44 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  uVar46 = *(uint *)(local_410 + 2);
  local_308 = *(uint *)(local_410 + lVar10 * 4 + 6);
  local_408 = (ulong)local_308;
  pGVar7 = (context->scene->geometries).items[uVar46].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar38 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_408 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar38);
  fVar51 = *pfVar1;
  fVar52 = pfVar1[1];
  fVar92 = pfVar1[2];
  fVar93 = pfVar1[3];
  lVar10 = uVar38 + 1;
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar10);
  fVar94 = *pfVar1;
  fVar95 = pfVar1[1];
  fVar96 = pfVar1[2];
  fVar116 = pfVar1[3];
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * uVar38);
  fVar117 = *pfVar1;
  fVar118 = pfVar1[1];
  fVar129 = pfVar1[2];
  fVar137 = pfVar1[3];
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * lVar10);
  fVar150 = *pfVar1;
  fVar151 = pfVar1[1];
  fVar172 = pfVar1[2];
  fVar152 = pfVar1[3];
  pfVar1 = (float *)((long)pGVar7[3].userPtr + uVar38 * *(long *)&pGVar7[3].fnumTimeSegments);
  pfVar2 = (float *)((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar10);
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar38);
  local_1d8 = *(float *)(ray + k * 4);
  fStack_1d4 = *(float *)(ray + k * 4 + 0x10);
  fVar130 = *(float *)(ray + k * 4 + 0x20);
  fVar170 = *pfVar3 * 0.33333334 + fVar51;
  fVar171 = pfVar3[1] * 0.33333334 + fVar52;
  fVar131 = pfVar3[2] * 0.33333334 + fVar92;
  fVar135 = pfVar3[3] * 0.33333334 + fVar93;
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar10);
  fVar201 = fVar94 - *pfVar3 * 0.33333334;
  fVar203 = fVar95 - pfVar3[1] * 0.33333334;
  fVar215 = fVar96 - pfVar3[2] * 0.33333334;
  fVar224 = fVar116 - pfVar3[3] * 0.33333334;
  fVar226 = *pfVar1 * 0.33333334 + fVar117;
  fVar232 = pfVar1[1] * 0.33333334 + fVar118;
  fVar233 = pfVar1[2] * 0.33333334 + fVar129;
  fVar235 = pfVar1[3] * 0.33333334 + fVar137;
  fVar246 = fVar150 - *pfVar2 * 0.33333334;
  fVar249 = fVar151 - pfVar2[1] * 0.33333334;
  fVar252 = fVar172 - pfVar2[2] * 0.33333334;
  fVar255 = fVar152 - pfVar2[3] * 0.33333334;
  fVar136 = fVar201 * 0.0;
  fVar176 = fVar203 * 0.0;
  fVar177 = fVar215 * 0.0;
  fVar178 = fVar224 * 0.0;
  fVar261 = fVar94 * 0.0 + fVar136;
  fVar263 = fVar95 * 0.0 + fVar176;
  fVar265 = fVar96 * 0.0 + fVar177;
  fVar234 = fVar116 * 0.0 + fVar178;
  fVar236 = fVar170 * 0.0;
  fVar247 = fVar171 * 0.0;
  fVar250 = fVar131 * 0.0;
  fVar253 = fVar135 * 0.0;
  fVar202 = fVar236 + fVar261 + fVar51;
  fVar214 = fVar247 + fVar263 + fVar52;
  fVar216 = fVar250 + fVar265 + fVar92;
  fVar225 = fVar253 + fVar234 + fVar93;
  fVar170 = (fVar170 * 3.0 + fVar261) - fVar51 * 3.0;
  fVar171 = (fVar171 * 3.0 + fVar263) - fVar52 * 3.0;
  fVar131 = (fVar131 * 3.0 + fVar265) - fVar92 * 3.0;
  fVar135 = (fVar135 * 3.0 + fVar234) - fVar93 * 3.0;
  fVar237 = fVar246 * 0.0;
  fVar248 = fVar249 * 0.0;
  fVar251 = fVar252 * 0.0;
  fVar254 = fVar255 * 0.0;
  fVar261 = fVar150 * 0.0 + fVar237;
  fVar263 = fVar151 * 0.0 + fVar248;
  fVar265 = fVar172 * 0.0 + fVar251;
  fVar234 = fVar152 * 0.0 + fVar254;
  fVar256 = fVar226 * 0.0;
  fVar262 = fVar232 * 0.0;
  fVar264 = fVar233 * 0.0;
  fVar266 = fVar235 * 0.0;
  fVar267 = fVar256 + fVar261 + fVar117;
  fVar270 = fVar262 + fVar263 + fVar118;
  fVar271 = fVar264 + fVar265 + fVar129;
  fVar272 = fVar266 + fVar234 + fVar137;
  fVar226 = (fVar226 * 3.0 + fVar261) - fVar117 * 3.0;
  fVar232 = (fVar232 * 3.0 + fVar263) - fVar118 * 3.0;
  fVar233 = (fVar233 * 3.0 + fVar265) - fVar129 * 3.0;
  fVar235 = (fVar235 * 3.0 + fVar234) - fVar137 * 3.0;
  fVar136 = fVar136 + fVar94 + fVar236 + fVar51 * 0.0;
  fVar176 = fVar176 + fVar95 + fVar247 + fVar52 * 0.0;
  fVar177 = fVar177 + fVar96 + fVar250 + fVar92 * 0.0;
  fVar178 = fVar178 + fVar116 + fVar253 + fVar93 * 0.0;
  fVar51 = ((fVar94 * 3.0 - fVar201 * 3.0) + fVar236) - fVar51 * 0.0;
  fVar52 = ((fVar95 * 3.0 - fVar203 * 3.0) + fVar247) - fVar52 * 0.0;
  fVar92 = ((fVar96 * 3.0 - fVar215 * 3.0) + fVar250) - fVar92 * 0.0;
  fVar93 = ((fVar116 * 3.0 - fVar224 * 3.0) + fVar253) - fVar93 * 0.0;
  fVar201 = fVar237 + fVar150 + fVar256 + fVar117 * 0.0;
  fVar203 = fVar248 + fVar151 + fVar262 + fVar118 * 0.0;
  fVar215 = fVar251 + fVar172 + fVar264 + fVar129 * 0.0;
  fVar224 = fVar254 + fVar152 + fVar266 + fVar137 * 0.0;
  fVar94 = ((fVar150 * 3.0 - fVar246 * 3.0) + fVar256) - fVar117 * 0.0;
  fVar95 = ((fVar151 * 3.0 - fVar249 * 3.0) + fVar262) - fVar118 * 0.0;
  fVar96 = ((fVar172 * 3.0 - fVar252 * 3.0) + fVar264) - fVar129 * 0.0;
  fVar116 = ((fVar152 * 3.0 - fVar255 * 3.0) + fVar266) - fVar137 * 0.0;
  fVar246 = fVar171 * fVar267 - fVar270 * fVar170;
  fVar252 = fVar131 * fVar270 - fVar271 * fVar171;
  fVar255 = fVar170 * fVar271 - fVar267 * fVar131;
  fVar261 = fVar135 * fVar272 - fVar272 * fVar135;
  fVar117 = fVar171 * fVar226 - fVar232 * fVar170;
  fVar129 = fVar131 * fVar232 - fVar233 * fVar171;
  fVar137 = fVar170 * fVar233 - fVar226 * fVar131;
  fVar152 = fVar52 * fVar201 - fVar203 * fVar51;
  fVar203 = fVar92 * fVar203 - fVar215 * fVar52;
  fVar215 = fVar51 * fVar215 - fVar201 * fVar92;
  fVar224 = fVar93 * fVar224 - fVar224 * fVar93;
  fVar150 = fVar52 * fVar94 - fVar95 * fVar51;
  fVar95 = fVar92 * fVar95 - fVar96 * fVar52;
  fVar96 = fVar51 * fVar96 - fVar94 * fVar92;
  fVar232 = fVar255 * fVar255 + fVar252 * fVar252 + fVar246 * fVar246;
  auVar158 = ZEXT416((uint)fVar232);
  auVar60 = rsqrtss(ZEXT416((uint)fVar232),auVar158);
  fVar94 = auVar60._0_4_;
  fVar233 = fVar94 * 1.5 - fVar94 * fVar94 * fVar232 * 0.5 * fVar94;
  fVar263 = fVar246 * fVar117 + fVar255 * fVar137 + fVar252 * fVar129;
  fVar94 = fVar261 * fVar233;
  auVar60 = rcpss(auVar158,auVar158);
  fVar118 = (2.0 - fVar232 * auVar60._0_4_) * auVar60._0_4_;
  fVar226 = fVar215 * fVar215 + fVar203 * fVar203 + fVar152 * fVar152;
  auVar60 = ZEXT416((uint)fVar226);
  auVar158 = rsqrtss(ZEXT416((uint)fVar226),auVar60);
  fVar151 = auVar158._0_4_;
  fVar201 = fVar151 * 1.5 - fVar151 * fVar151 * fVar226 * 0.5 * fVar151;
  fVar249 = fVar152 * fVar150 + fVar215 * fVar96 + fVar203 * fVar95;
  fVar172 = fVar224 * fVar201;
  auVar60 = rcpss(auVar60,auVar60);
  fVar151 = (2.0 - fVar226 * auVar60._0_4_) * auVar60._0_4_;
  local_388 = fVar225 * fVar252 * fVar233;
  fStack_384 = fVar225 * fVar255 * fVar233;
  fStack_380 = fVar225 * fVar246 * fVar233;
  fStack_37c = fVar225 * fVar94;
  local_398 = fVar202 - local_388;
  fStack_394 = fVar214 - fStack_384;
  fStack_390 = fVar216 - fStack_380;
  fStack_38c = fVar225 - fStack_37c;
  fVar252 = fVar225 * fVar118 * (fVar232 * fVar129 - fVar263 * fVar252) * fVar233 +
            fVar135 * fVar252 * fVar233;
  fVar255 = fVar225 * fVar118 * (fVar232 * fVar137 - fVar263 * fVar255) * fVar233 +
            fVar135 * fVar255 * fVar233;
  fVar246 = fVar225 * fVar118 * (fVar232 * fVar117 - fVar263 * fVar246) * fVar233 +
            fVar135 * fVar246 * fVar233;
  fVar232 = fVar225 * fVar118 * (fVar232 * (fVar135 * fVar235 - fVar235 * fVar135) -
                                fVar263 * fVar261) * fVar233 + fVar135 * fVar94;
  local_388 = local_388 + fVar202;
  fStack_384 = fStack_384 + fVar214;
  fStack_380 = fStack_380 + fVar216;
  fStack_37c = fStack_37c + fVar225;
  fVar117 = fVar178 * fVar203 * fVar201;
  fVar118 = fVar178 * fVar215 * fVar201;
  fVar129 = fVar178 * fVar152 * fVar201;
  fVar137 = fVar178 * fVar172;
  local_3b8 = fVar136 - fVar117;
  fStack_3b4 = fVar176 - fVar118;
  fStack_3b0 = fVar177 - fVar129;
  fStack_3ac = fVar178 - fVar137;
  fVar94 = fVar178 * fVar151 * (fVar226 * fVar95 - fVar249 * fVar203) * fVar201 +
           fVar93 * fVar203 * fVar201;
  fVar95 = fVar178 * fVar151 * (fVar226 * fVar96 - fVar249 * fVar215) * fVar201 +
           fVar93 * fVar215 * fVar201;
  fVar96 = fVar178 * fVar151 * (fVar226 * fVar150 - fVar249 * fVar152) * fVar201 +
           fVar93 * fVar152 * fVar201;
  fVar116 = fVar178 * fVar151 * (fVar226 * (fVar93 * fVar116 - fVar116 * fVar93) - fVar249 * fVar224
                                ) * fVar201 + fVar93 * fVar172;
  fVar117 = fVar117 + fVar136;
  fVar118 = fVar118 + fVar176;
  fVar129 = fVar129 + fVar177;
  fVar137 = fVar137 + fVar178;
  local_3a8 = (fVar170 - fVar252) * 0.33333334 + local_398;
  fStack_3a4 = (fVar171 - fVar255) * 0.33333334 + fStack_394;
  fStack_3a0 = (fVar131 - fVar246) * 0.33333334 + fStack_390;
  fStack_39c = (fVar135 - fVar232) * 0.33333334 + fStack_38c;
  local_3c8 = local_3b8 - (fVar51 - fVar94) * 0.33333334;
  fStack_3c4 = fStack_3b4 - (fVar52 - fVar95) * 0.33333334;
  fStack_3c0 = fStack_3b0 - (fVar92 - fVar96) * 0.33333334;
  fStack_3bc = fStack_3ac - (fVar93 - fVar116) * 0.33333334;
  fVar150 = fVar117 - (fVar94 + fVar51) * 0.33333334;
  fVar151 = fVar118 - (fVar95 + fVar52) * 0.33333334;
  fVar96 = fVar129 - (fVar96 + fVar92) * 0.33333334;
  fVar116 = fVar137 - (fVar116 + fVar93) * 0.33333334;
  local_168 = local_398 - local_1d8;
  fStack_164 = fStack_394 - fStack_1d4;
  fStack_160 = fStack_390 - fVar130;
  fStack_15c = fStack_38c - 0.0;
  fVar51 = pre->ray_space[k].vx.field_0.m128[0];
  fVar52 = pre->ray_space[k].vx.field_0.m128[1];
  fVar92 = pre->ray_space[k].vy.field_0.m128[0];
  fVar93 = pre->ray_space[k].vy.field_0.m128[1];
  fVar94 = pre->ray_space[k].vz.field_0.m128[0];
  fVar95 = pre->ray_space[k].vz.field_0.m128[1];
  fVar177 = local_168 * fVar51 + fStack_164 * fVar92 + fStack_160 * fVar94;
  fVar178 = local_168 * fVar52 + fStack_164 * fVar93 + fStack_160 * fVar95;
  auVar74._4_4_ = fVar178;
  auVar74._0_4_ = fVar177;
  local_178 = local_3a8 - local_1d8;
  fStack_174 = fStack_3a4 - fStack_1d4;
  fStack_170 = fStack_3a0 - fVar130;
  fStack_16c = fStack_39c - 0.0;
  fVar215 = local_178 * fVar51 + fStack_174 * fVar92 + fStack_170 * fVar94;
  fVar216 = local_178 * fVar52 + fStack_174 * fVar93 + fStack_170 * fVar95;
  auVar160._4_4_ = fVar216;
  auVar160._0_4_ = fVar215;
  local_188 = local_3c8 - local_1d8;
  fStack_184 = fStack_3c4 - fStack_1d4;
  fStack_180 = fStack_3c0 - fVar130;
  fStack_17c = fStack_3bc - 0.0;
  fVar136 = local_188 * fVar51 + fStack_184 * fVar92 + fStack_180 * fVar94;
  fVar176 = local_188 * fVar52 + fStack_184 * fVar93 + fStack_180 * fVar95;
  local_338 = CONCAT44(fVar176,fVar136);
  local_198 = local_3b8 - local_1d8;
  fStack_194 = fStack_3b4 - fStack_1d4;
  fStack_190 = fStack_3b0 - fVar130;
  fStack_18c = fStack_3ac - 0.0;
  fVar203 = local_198 * fVar51 + fStack_194 * fVar92 + fStack_190 * fVar94;
  fVar214 = local_198 * fVar52 + fStack_194 * fVar93 + fStack_190 * fVar95;
  local_118._4_4_ = fVar214;
  local_118._0_4_ = fVar203;
  local_1a8 = local_388 - local_1d8;
  fStack_1a4 = fStack_384 - fStack_1d4;
  fStack_1a0 = fStack_380 - fVar130;
  fStack_19c = fStack_37c - 0.0;
  fVar201 = local_1a8 * fVar51 + fStack_1a4 * fVar92 + fStack_1a0 * fVar94;
  fVar202 = local_1a8 * fVar52 + fStack_1a4 * fVar93 + fStack_1a0 * fVar95;
  local_298 = (fVar252 + fVar170) * 0.33333334 + local_388;
  fStack_294 = (fVar255 + fVar171) * 0.33333334 + fStack_384;
  fStack_290 = (fVar246 + fVar131) * 0.33333334 + fStack_380;
  fStack_28c = (fVar232 + fVar135) * 0.33333334 + fStack_37c;
  local_1b8 = local_298 - local_1d8;
  fStack_1b4 = fStack_294 - fStack_1d4;
  fStack_1b0 = fStack_290 - fVar130;
  fStack_1ac = fStack_28c - 0.0;
  fVar170 = local_1b8 * fVar51 + fStack_1b4 * fVar92 + fStack_1b0 * fVar94;
  fVar171 = local_1b8 * fVar52 + fStack_1b4 * fVar93 + fStack_1b0 * fVar95;
  local_1c8 = fVar150 - local_1d8;
  fStack_1c4 = fVar151 - fStack_1d4;
  fStack_1c0 = fVar96 - fVar130;
  fStack_1bc = fVar116 - 0.0;
  fVar172 = local_1c8 * fVar51 + fStack_1c4 * fVar92 + fStack_1c0 * fVar94;
  fVar152 = local_1c8 * fVar52 + fStack_1c4 * fVar93 + fStack_1c0 * fVar95;
  local_1d8 = fVar117 - local_1d8;
  fStack_1d4 = fVar118 - fStack_1d4;
  fStack_1d0 = fVar129 - fVar130;
  fStack_1cc = fVar137 - 0.0;
  fVar51 = local_1d8 * fVar51 + fStack_1d4 * fVar92 + fStack_1d0 * fVar94;
  fVar52 = local_1d8 * fVar52 + fStack_1d4 * fVar93 + fStack_1d0 * fVar95;
  fStack_10c = fVar52;
  fStack_110 = fVar51;
  auVar160._8_8_ = CONCAT44(fVar171,fVar170);
  auVar74._8_4_ = fVar201;
  auVar74._12_4_ = fVar202;
  auVar60 = minps(auVar74,auVar160);
  auVar103._8_4_ = fVar172;
  auVar103._0_8_ = local_338;
  auVar103._12_4_ = fVar152;
  auVar158 = minps(auVar103,_local_118);
  auVar60 = minps(auVar60,auVar158);
  auVar104._4_4_ = fVar178;
  auVar104._0_4_ = fVar177;
  auVar104._8_4_ = fVar201;
  auVar104._12_4_ = fVar202;
  auVar158 = maxps(auVar104,auVar160);
  auVar121._4_4_ = fVar176;
  auVar121._0_4_ = fVar136;
  auVar121._8_4_ = fVar172;
  auVar121._12_4_ = fVar152;
  auVar122 = maxps(auVar121,_local_118);
  auVar159 = maxps(auVar158,auVar122);
  auVar11._4_8_ = auVar122._8_8_;
  auVar11._0_4_ = auVar60._4_4_;
  auVar123._0_8_ = auVar11._0_8_ << 0x20;
  auVar123._8_4_ = auVar60._8_4_;
  auVar123._12_4_ = auVar60._12_4_;
  auVar124._8_8_ = auVar60._8_8_;
  auVar124._0_8_ = auVar123._8_8_;
  auVar158 = minps(auVar60,auVar124);
  auVar12._4_8_ = auVar60._8_8_;
  auVar12._0_4_ = auVar159._4_4_;
  auVar125._0_8_ = auVar12._0_8_ << 0x20;
  auVar125._8_4_ = auVar159._8_4_;
  auVar125._12_4_ = auVar159._12_4_;
  auVar126._8_8_ = auVar159._8_8_;
  auVar126._0_8_ = auVar125._8_8_;
  auVar60 = maxps(auVar159,auVar126);
  auVar75._0_8_ = auVar158._0_8_ & 0x7fffffff7fffffff;
  auVar75._8_4_ = auVar158._8_4_ & 0x7fffffff;
  auVar75._12_4_ = auVar158._12_4_ & 0x7fffffff;
  auVar105._0_8_ = auVar60._0_8_ & 0x7fffffff7fffffff;
  auVar105._8_4_ = auVar60._8_4_ & 0x7fffffff;
  auVar105._12_4_ = auVar60._12_4_ & 0x7fffffff;
  auVar60 = maxps(auVar75,auVar105);
  fStack_124 = auVar60._4_4_;
  local_128 = fStack_124;
  if (fStack_124 <= auVar60._0_4_) {
    local_128 = auVar60._0_4_;
  }
  uVar38 = (ulong)uVar44 + 0xf;
  local_128 = local_128 * 9.536743e-07;
  fStack_120 = fStack_124;
  fStack_11c = fStack_124;
  local_268 = local_128;
  fStack_264 = local_128;
  fStack_260 = local_128;
  fStack_25c = local_128;
  local_278 = -local_128;
  fStack_274 = -local_128;
  fStack_270 = -local_128;
  fStack_26c = -local_128;
  local_138 = fVar215 - fVar177;
  fStack_134 = fVar216 - fVar178;
  fStack_130 = fVar170 - fVar201;
  fStack_12c = fVar171 - fVar202;
  local_148 = fVar136 - fVar215;
  fStack_144 = fVar176 - fVar216;
  fStack_140 = fVar172 - fVar170;
  fStack_13c = fVar152 - fVar171;
  fStack_324 = fVar152;
  local_328 = fVar172;
  uStack_320 = CONCAT44(fVar171,fVar170);
  local_158 = fVar203 - fVar136;
  fStack_154 = fVar214 - fVar176;
  fStack_150 = fVar51 - fVar172;
  fStack_14c = fVar52 - fVar152;
  local_2a8 = local_388 - local_398;
  fStack_2a4 = fStack_384 - fStack_394;
  fStack_2a0 = fStack_380 - fStack_390;
  fStack_29c = fStack_37c - fStack_38c;
  local_2b8 = local_298 - local_3a8;
  fStack_2b4 = fStack_294 - fStack_3a4;
  fStack_2b0 = fStack_290 - fStack_3a0;
  fStack_2ac = fStack_28c - fStack_39c;
  local_2c8 = fVar150 - local_3c8;
  fStack_2c4 = fVar151 - fStack_3c4;
  fStack_2c0 = fVar96 - fStack_3c0;
  fStack_2bc = fVar116 - fStack_3bc;
  local_2d8 = fVar117 - local_3b8;
  fStack_2d4 = fVar118 - fStack_3b4;
  fStack_2d0 = fVar129 - fStack_3b0;
  fStack_2cc = fVar137 - fStack_3ac;
  local_2f8 = uVar46;
  uStack_2f4 = uVar46;
  uStack_2f0 = uVar46;
  uStack_2ec = uVar46;
  uStack_304 = local_308;
  uStack_300 = local_308;
  uStack_2fc = local_308;
  uVar42 = 0;
  fVar92 = *(float *)(ray + k * 4 + 0x30);
  fVar93 = 0.0;
  fVar94 = 1.0;
  fVar95 = 0.0;
  fVar116 = 1.0;
  local_400 = uVar38;
LAB_00a72f94:
  do {
    fVar137 = 1.0 - fVar93;
    fVar131 = 1.0 - fVar93;
    fVar135 = 1.0 - fVar94;
    fVar224 = 1.0 - fVar94;
    fVar265 = fVar177 * fVar137 + fVar201 * fVar93;
    fVar250 = fVar178 * fVar131 + fVar202 * fVar93;
    fVar251 = fVar177 * fVar135 + fVar201 * fVar94;
    fVar253 = fVar178 * fVar224 + fVar202 * fVar94;
    fVar225 = fVar215 * fVar137 + fVar170 * fVar93;
    fVar237 = fVar216 * fVar131 + fVar171 * fVar93;
    fVar247 = fVar215 * fVar135 + fVar170 * fVar94;
    fVar248 = fVar216 * fVar224 + fVar171 * fVar94;
    fVar262 = fVar136 * fVar137 + fVar172 * fVar93;
    fVar264 = fVar176 * fVar131 + fVar152 * fVar93;
    fVar280 = fVar136 * fVar135 + fVar172 * fVar94;
    fVar281 = fVar176 * fVar224 + fVar152 * fVar94;
    fVar254 = fVar137 * fVar203 + fVar93 * fVar51;
    fVar256 = fVar131 * fVar214 + fVar93 * fVar52;
    fVar270 = fVar135 * fVar203 + fVar94 * fVar51;
    fVar271 = fVar224 * fVar214 + fVar94 * fVar52;
    fVar272 = (fVar116 - fVar95) * 0.11111111;
    local_508 = CONCAT44(fVar116,fVar95);
    fVar273 = (fVar116 - fVar95) * 0.0 + fVar95;
    fVar277 = (fVar116 - fVar95) * 0.33333334 + fVar95;
    fVar278 = (fVar116 - fVar95) * 0.6666667 + fVar95;
    fVar95 = (fVar116 - fVar95) * 1.0 + fVar95;
    fVar131 = 1.0 - fVar273;
    fVar224 = 1.0 - fVar277;
    fVar226 = 1.0 - fVar278;
    fVar246 = 1.0 - fVar95;
    fVar232 = fVar225 * fVar131 + fVar262 * fVar273;
    fVar233 = fVar225 * fVar224 + fVar262 * fVar277;
    fVar235 = fVar225 * fVar226 + fVar262 * fVar278;
    fVar249 = fVar225 * fVar246 + fVar262 * fVar95;
    fVar252 = fVar237 * fVar131 + fVar264 * fVar273;
    fVar255 = fVar237 * fVar224 + fVar264 * fVar277;
    fVar261 = fVar237 * fVar226 + fVar264 * fVar278;
    fVar263 = fVar237 * fVar246 + fVar264 * fVar95;
    fVar116 = (fVar265 * fVar131 + fVar225 * fVar273) * fVar131 + fVar273 * fVar232;
    fVar137 = (fVar265 * fVar224 + fVar225 * fVar277) * fVar224 + fVar277 * fVar233;
    fVar135 = (fVar265 * fVar226 + fVar225 * fVar278) * fVar226 + fVar278 * fVar235;
    fVar225 = (fVar265 * fVar246 + fVar225 * fVar95) * fVar246 + fVar95 * fVar249;
    fVar265 = (fVar250 * fVar131 + fVar237 * fVar273) * fVar131 + fVar273 * fVar252;
    fVar234 = (fVar250 * fVar224 + fVar237 * fVar277) * fVar224 + fVar277 * fVar255;
    fVar236 = (fVar250 * fVar226 + fVar237 * fVar278) * fVar226 + fVar278 * fVar261;
    fVar237 = (fVar250 * fVar246 + fVar237 * fVar95) * fVar246 + fVar95 * fVar263;
    fVar232 = fVar232 * fVar131 + (fVar262 * fVar131 + fVar254 * fVar273) * fVar273;
    fVar233 = fVar233 * fVar224 + (fVar262 * fVar224 + fVar254 * fVar277) * fVar277;
    fVar235 = fVar235 * fVar226 + (fVar262 * fVar226 + fVar254 * fVar278) * fVar278;
    fVar249 = fVar249 * fVar246 + (fVar262 * fVar246 + fVar254 * fVar95) * fVar95;
    fVar252 = fVar252 * fVar131 + (fVar264 * fVar131 + fVar256 * fVar273) * fVar273;
    fVar255 = fVar255 * fVar224 + (fVar264 * fVar224 + fVar256 * fVar277) * fVar277;
    fVar261 = fVar261 * fVar226 + (fVar264 * fVar226 + fVar256 * fVar278) * fVar278;
    fVar263 = fVar263 * fVar246 + (fVar264 * fVar246 + fVar256 * fVar95) * fVar95;
    local_378 = fVar131 * fVar116 + fVar273 * fVar232;
    fStack_374 = fVar224 * fVar137 + fVar277 * fVar233;
    fStack_370 = fVar226 * fVar135 + fVar278 * fVar235;
    fStack_36c = fVar246 * fVar225 + fVar95 * fVar249;
    local_258 = fVar131 * fVar265 + fVar273 * fVar252;
    fStack_254 = fVar224 * fVar234 + fVar277 * fVar255;
    fStack_250 = fVar226 * fVar236 + fVar278 * fVar261;
    fStack_24c = fVar246 * fVar237 + fVar95 * fVar263;
    fVar233 = (fVar233 - fVar137) * 3.0 * fVar272;
    fVar235 = (fVar235 - fVar135) * 3.0 * fVar272;
    fVar249 = (fVar249 - fVar225) * 3.0 * fVar272;
    fVar255 = (fVar255 - fVar234) * 3.0 * fVar272;
    fVar261 = (fVar261 - fVar236) * 3.0 * fVar272;
    fVar263 = (fVar263 - fVar237) * 3.0 * fVar272;
    local_348._4_4_ = fStack_370;
    local_348._0_4_ = fStack_374;
    local_348._8_4_ = fStack_36c;
    local_348._12_4_ = 0;
    local_1f8._4_4_ = fStack_250;
    local_1f8._0_4_ = fStack_254;
    local_358 = local_378 + (fVar232 - fVar116) * 3.0 * fVar272;
    fStack_354 = fStack_374 + fVar233;
    fStack_350 = fStack_370 + fVar235;
    fStack_34c = fStack_36c + fVar249;
    fVar116 = local_258 + (fVar252 - fVar265) * 3.0 * fVar272;
    fVar137 = fStack_254 + fVar255;
    fVar135 = fStack_250 + fVar261;
    fVar225 = fStack_24c + fVar263;
    local_368._0_4_ = fStack_374 - fVar233;
    local_368._4_4_ = fStack_370 - fVar235;
    local_368._8_4_ = fStack_36c - fVar249;
    local_368._12_4_ = 0;
    auVar76._0_4_ = fStack_254 - fVar255;
    auVar76._4_4_ = fStack_250 - fVar261;
    auVar76._8_4_ = fStack_24c - fVar263;
    auVar76._12_4_ = 0;
    fVar232 = fVar247 * fVar131 + fVar280 * fVar273;
    fVar233 = fVar247 * fVar224 + fVar280 * fVar277;
    fVar235 = fVar247 * fVar226 + fVar280 * fVar278;
    fVar249 = fVar247 * fVar246 + fVar280 * fVar95;
    fVar252 = fVar248 * fVar131 + fVar281 * fVar273;
    fVar255 = fVar248 * fVar224 + fVar281 * fVar277;
    fVar261 = fVar248 * fVar226 + fVar281 * fVar278;
    fVar256 = fVar248 * fVar246 + fVar281 * fVar95;
    fVar263 = (fVar251 * fVar131 + fVar247 * fVar273) * fVar131 + fVar273 * fVar232;
    fVar265 = (fVar251 * fVar224 + fVar247 * fVar277) * fVar224 + fVar277 * fVar233;
    fVar234 = (fVar251 * fVar226 + fVar247 * fVar278) * fVar226 + fVar278 * fVar235;
    fVar236 = (fVar251 * fVar246 + fVar247 * fVar95) * fVar246 + fVar95 * fVar249;
    fVar262 = (fVar253 * fVar131 + fVar248 * fVar273) * fVar131 + fVar273 * fVar252;
    fVar264 = (fVar253 * fVar224 + fVar248 * fVar277) * fVar224 + fVar277 * fVar255;
    fVar266 = (fVar253 * fVar226 + fVar248 * fVar278) * fVar226 + fVar278 * fVar261;
    fVar267 = (fVar253 * fVar246 + fVar248 * fVar95) * fVar246 + fVar95 * fVar256;
    fVar237 = fVar232 * fVar131 + (fVar280 * fVar131 + fVar270 * fVar273) * fVar273;
    fVar247 = fVar233 * fVar224 + (fVar280 * fVar224 + fVar270 * fVar277) * fVar277;
    fVar248 = fVar235 * fVar226 + (fVar280 * fVar226 + fVar270 * fVar278) * fVar278;
    fVar250 = fVar249 * fVar246 + (fVar280 * fVar246 + fVar270 * fVar95) * fVar95;
    fVar251 = fVar252 * fVar131 + (fVar281 * fVar131 + fVar271 * fVar273) * fVar273;
    fVar253 = fVar255 * fVar224 + (fVar281 * fVar224 + fVar271 * fVar277) * fVar277;
    fVar254 = fVar261 * fVar226 + (fVar281 * fVar226 + fVar271 * fVar278) * fVar278;
    fVar256 = fVar256 * fVar246 + (fVar281 * fVar246 + fVar271 * fVar95) * fVar95;
    fVar249 = fVar131 * fVar263 + fVar273 * fVar237;
    fVar252 = fVar224 * fVar265 + fVar277 * fVar247;
    fVar255 = fVar226 * fVar234 + fVar278 * fVar248;
    fVar261 = fVar246 * fVar236 + fVar95 * fVar250;
    fVar232 = fVar131 * fVar262 + fVar273 * fVar251;
    fVar233 = fVar224 * fVar264 + fVar277 * fVar253;
    fVar235 = fVar226 * fVar266 + fVar278 * fVar254;
    fVar246 = fVar246 * fVar267 + fVar95 * fVar256;
    fVar95 = (fVar247 - fVar265) * 3.0 * fVar272;
    fVar131 = (fVar248 - fVar234) * 3.0 * fVar272;
    fVar224 = (fVar250 - fVar236) * 3.0 * fVar272;
    fVar226 = (fVar253 - fVar264) * 3.0 * fVar272;
    fVar265 = (fVar254 - fVar266) * 3.0 * fVar272;
    fVar234 = (fVar256 - fVar267) * 3.0 * fVar272;
    local_208._4_4_ = fVar255;
    local_208._0_4_ = fVar252;
    local_208._8_4_ = fVar261;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar235;
    local_228._0_4_ = fVar233;
    local_228._8_4_ = fVar246;
    local_228._12_4_ = 0;
    local_248 = fVar249 + (fVar237 - fVar263) * 3.0 * fVar272;
    fStack_244 = fVar252 + fVar95;
    fStack_240 = fVar255 + fVar131;
    fStack_23c = fVar261 + fVar224;
    local_218 = fVar232 + (fVar251 - fVar262) * 3.0 * fVar272;
    fStack_214 = fVar233 + fVar226;
    fStack_210 = fVar235 + fVar265;
    fStack_20c = fVar246 + fVar234;
    local_1e8._0_4_ = fVar252 - fVar95;
    local_1e8._4_4_ = fVar255 - fVar131;
    local_1e8._8_4_ = fVar261 - fVar224;
    local_1e8._12_4_ = 0;
    local_238._0_4_ = fVar233 - fVar226;
    local_238._4_4_ = fVar235 - fVar265;
    local_238._8_4_ = fVar246 - fVar234;
    local_238._12_4_ = 0;
    fVar95 = (fVar252 - fStack_374) + (fVar249 - local_378);
    fVar131 = (fVar255 - fStack_370) + (fVar252 - fStack_374);
    fVar224 = (fVar261 - fStack_36c) + (fVar255 - fStack_370);
    fVar226 = (fVar261 - fStack_36c) + 0.0;
    local_1f8._8_4_ = fStack_24c;
    local_1f8._12_4_ = 0;
    fVar263 = (fVar233 - fStack_254) + (fVar232 - local_258);
    fVar265 = (fVar235 - fStack_250) + (fVar233 - fStack_254);
    fVar234 = (fVar246 - fStack_24c) + (fVar235 - fStack_250);
    fVar236 = (fVar246 - fStack_24c) + 0.0;
    auVar193._0_8_ =
         CONCAT44(fStack_254 * fVar131 - fStack_374 * fVar265,
                  local_258 * fVar95 - local_378 * fVar263);
    auVar193._8_4_ = fStack_250 * fVar224 - fStack_370 * fVar234;
    auVar193._12_4_ = fStack_24c * fVar226 - fStack_36c * fVar236;
    auVar140._0_4_ = fVar116 * fVar95 - local_358 * fVar263;
    auVar140._4_4_ = fVar137 * fVar131 - fStack_354 * fVar265;
    auVar140._8_4_ = fVar135 * fVar224 - fStack_350 * fVar234;
    auVar140._12_4_ = fVar225 * fVar226 - fStack_34c * fVar236;
    auVar161._0_8_ =
         CONCAT44(auVar76._4_4_ * fVar131 - fVar265 * local_368._4_4_,
                  auVar76._0_4_ * fVar95 - fVar263 * local_368._0_4_);
    auVar161._8_4_ = auVar76._8_4_ * fVar224 - fVar234 * local_368._8_4_;
    auVar161._12_4_ = fVar226 * 0.0 - fVar236 * 0.0;
    auVar258._0_4_ = fVar95 * fStack_254 - fVar263 * fStack_374;
    auVar258._4_4_ = fVar131 * fStack_250 - fVar265 * fStack_370;
    auVar258._8_4_ = fVar224 * fStack_24c - fVar234 * fStack_36c;
    auVar258._12_4_ = fVar226 * 0.0 - fVar236 * 0.0;
    auVar217._0_8_ =
         CONCAT44(fVar233 * fVar131 - fVar252 * fVar265,fVar232 * fVar95 - fVar249 * fVar263);
    auVar217._8_4_ = fVar235 * fVar224 - fVar255 * fVar234;
    auVar217._12_4_ = fVar246 * fVar226 - fVar261 * fVar236;
    auVar268._0_4_ = local_218 * fVar95 - local_248 * fVar263;
    auVar268._4_4_ = fStack_214 * fVar131 - fStack_244 * fVar265;
    auVar268._8_4_ = fStack_210 * fVar224 - fStack_240 * fVar234;
    auVar268._12_4_ = fStack_20c * fVar226 - fStack_23c * fVar236;
    auVar205._0_8_ =
         CONCAT44(local_238._4_4_ * fVar131 - fVar265 * local_1e8._4_4_,
                  local_238._0_4_ * fVar95 - fVar263 * local_1e8._0_4_);
    auVar205._8_4_ = local_238._8_4_ * fVar224 - fVar234 * local_1e8._8_4_;
    auVar205._12_4_ = fVar226 * 0.0 - fVar236 * 0.0;
    auVar77._0_4_ = fVar95 * fVar233 - fVar263 * fVar252;
    auVar77._4_4_ = fVar131 * fVar235 - fVar265 * fVar255;
    auVar77._8_4_ = fVar224 * fVar246 - fVar234 * fVar261;
    auVar77._12_4_ = fVar226 * 0.0 - fVar236 * 0.0;
    auVar106._8_4_ = auVar193._8_4_;
    auVar106._0_8_ = auVar193._0_8_;
    auVar106._12_4_ = auVar193._12_4_;
    auVar60 = minps(auVar106,auVar140);
    auVar159 = maxps(auVar193,auVar140);
    auVar141._8_4_ = auVar161._8_4_;
    auVar141._0_8_ = auVar161._0_8_;
    auVar141._12_4_ = auVar161._12_4_;
    auVar158 = minps(auVar141,auVar258);
    auVar60 = minps(auVar60,auVar158);
    auVar158 = maxps(auVar161,auVar258);
    auVar122 = maxps(auVar159,auVar158);
    auVar142._8_4_ = auVar217._8_4_;
    auVar142._0_8_ = auVar217._0_8_;
    auVar142._12_4_ = auVar217._12_4_;
    auVar158 = minps(auVar142,auVar268);
    auVar218 = maxps(auVar217,auVar268);
    auVar162._8_4_ = auVar205._8_4_;
    auVar162._0_8_ = auVar205._0_8_;
    auVar162._12_4_ = auVar205._12_4_;
    auVar159 = minps(auVar162,auVar77);
    auVar158 = minps(auVar158,auVar159);
    auVar60 = minps(auVar60,auVar158);
    auVar158 = maxps(auVar205,auVar77);
    auVar158 = maxps(auVar218,auVar158);
    auVar158 = maxps(auVar122,auVar158);
    auVar194._0_4_ =
         -(uint)(local_278 <= auVar158._0_4_ && auVar60._0_4_ <= local_268) & local_288._0_4_;
    auVar194._4_4_ =
         -(uint)(fStack_274 <= auVar158._4_4_ && auVar60._4_4_ <= fStack_264) & local_288._4_4_;
    auVar194._8_4_ =
         -(uint)(fStack_270 <= auVar158._8_4_ && auVar60._8_4_ <= fStack_260) & local_288._8_4_;
    auVar194._12_4_ =
         -(uint)(fStack_26c <= auVar158._12_4_ && auVar60._12_4_ <= fStack_25c) & local_288._12_4_;
    uVar48 = movmskps((int)uVar38,auVar194);
    pRVar39 = (RayHitK<4> *)(ulong)uVar48;
    if (uVar48 != 0) {
      fVar95 = (fVar252 - fVar249) + (fStack_374 - local_378);
      fVar131 = (fVar255 - fVar252) + (fStack_370 - fStack_374);
      fVar224 = (fVar261 - fVar255) + (fStack_36c - fStack_370);
      fVar226 = (0.0 - fVar261) + (0.0 - fStack_36c);
      fVar263 = (fVar233 - fVar232) + (fStack_254 - local_258);
      fVar265 = (fVar235 - fVar233) + (fStack_250 - fStack_254);
      fVar234 = (fVar246 - fVar235) + (fStack_24c - fStack_250);
      fVar236 = (0.0 - fVar246) + (0.0 - fStack_24c);
      auVar274._0_8_ =
           CONCAT44(fStack_254 * fVar131 - fStack_374 * fVar265,
                    local_258 * fVar95 - local_378 * fVar263);
      auVar274._8_4_ = fStack_250 * fVar224 - fStack_370 * fVar234;
      auVar274._12_4_ = fStack_24c * fVar226 - fStack_36c * fVar236;
      auVar143._0_4_ = fVar116 * fVar95 - local_358 * fVar263;
      auVar143._4_4_ = fVar137 * fVar131 - fStack_354 * fVar265;
      auVar143._8_4_ = fVar135 * fVar224 - fStack_350 * fVar234;
      auVar143._12_4_ = fVar225 * fVar226 - fStack_34c * fVar236;
      auVar206._0_8_ =
           CONCAT44(auVar76._4_4_ * fVar131 - local_368._4_4_ * fVar265,
                    auVar76._0_4_ * fVar95 - local_368._0_4_ * fVar263);
      auVar206._8_4_ = auVar76._8_4_ * fVar224 - local_368._8_4_ * fVar234;
      auVar206._12_4_ = fVar226 * 0.0 - fVar236 * 0.0;
      auVar163._0_4_ = fStack_254 * fVar95 - fStack_374 * fVar263;
      auVar163._4_4_ = fStack_250 * fVar131 - fStack_370 * fVar265;
      auVar163._8_4_ = fStack_24c * fVar224 - fStack_36c * fVar234;
      auVar163._12_4_ = fVar226 * 0.0 - fVar236 * 0.0;
      auVar127._0_8_ =
           CONCAT44(fVar233 * fVar131 - fVar252 * fVar265,fVar232 * fVar95 - fVar249 * fVar263);
      auVar127._8_4_ = fVar235 * fVar224 - fVar255 * fVar234;
      auVar127._12_4_ = fVar246 * fVar226 - fVar261 * fVar236;
      auVar227._0_4_ = local_218 * fVar95 - local_248 * fVar263;
      auVar227._4_4_ = fStack_214 * fVar131 - fStack_244 * fVar265;
      auVar227._8_4_ = fStack_210 * fVar224 - fStack_240 * fVar234;
      auVar227._12_4_ = fStack_20c * fVar226 - fStack_23c * fVar236;
      auVar259._0_8_ =
           CONCAT44(local_238._4_4_ * fVar131 - local_1e8._4_4_ * fVar265,
                    local_238._0_4_ * fVar95 - local_1e8._0_4_ * fVar263);
      auVar259._8_4_ = local_238._8_4_ * fVar224 - local_1e8._8_4_ * fVar234;
      auVar259._12_4_ = fVar226 * 0.0 - fVar236 * 0.0;
      auVar78._0_4_ = fVar95 * fVar233 - fVar263 * fVar252;
      auVar78._4_4_ = fVar131 * fVar235 - fVar265 * fVar255;
      auVar78._8_4_ = fVar224 * fVar246 - fVar234 * fVar261;
      auVar78._12_4_ = fVar226 * 0.0 - fVar236 * 0.0;
      auVar107._8_4_ = auVar274._8_4_;
      auVar107._0_8_ = auVar274._0_8_;
      auVar107._12_4_ = auVar274._12_4_;
      auVar60 = minps(auVar107,auVar143);
      auVar159 = maxps(auVar274,auVar143);
      auVar144._8_4_ = auVar206._8_4_;
      auVar144._0_8_ = auVar206._0_8_;
      auVar144._12_4_ = auVar206._12_4_;
      auVar158 = minps(auVar144,auVar163);
      auVar60 = minps(auVar60,auVar158);
      auVar158 = maxps(auVar206,auVar163);
      auVar218 = maxps(auVar159,auVar158);
      auVar145._8_4_ = auVar127._8_4_;
      auVar145._0_8_ = auVar127._0_8_;
      auVar145._12_4_ = auVar127._12_4_;
      auVar159 = minps(auVar145,auVar227);
      auVar158 = maxps(auVar127,auVar227);
      auVar164._8_4_ = auVar259._8_4_;
      auVar164._0_8_ = auVar259._0_8_;
      auVar164._12_4_ = auVar259._12_4_;
      auVar122 = minps(auVar164,auVar78);
      auVar159 = minps(auVar159,auVar122);
      auVar60 = minps(auVar60,auVar159);
      auVar159 = maxps(auVar259,auVar78);
      auVar158 = maxps(auVar158,auVar159);
      auVar158 = maxps(auVar218,auVar158);
      auVar275._0_4_ =
           -(uint)(local_278 <= auVar158._0_4_ && auVar60._0_4_ <= local_268) & auVar194._0_4_;
      auVar275._4_4_ =
           -(uint)(fStack_274 <= auVar158._4_4_ && auVar60._4_4_ <= fStack_264) & auVar194._4_4_;
      auVar275._8_4_ =
           -(uint)(fStack_270 <= auVar158._8_4_ && auVar60._8_4_ <= fStack_260) & auVar194._8_4_;
      auVar275._12_4_ =
           -(uint)(fStack_26c <= auVar158._12_4_ && auVar60._12_4_ <= fStack_25c) & auVar194._12_4_;
      uVar48 = movmskps(uVar48,auVar275);
      pRVar39 = (RayHitK<4> *)(ulong)uVar48;
      if (uVar48 != 0) {
        pRVar39 = (RayHitK<4> *)(ulong)(byte)uVar48;
        auStack_318[uVar42] = uVar48 & 0xff;
        *(undefined8 *)(afStack_108 + uVar42 * 2) = local_508;
        *(ulong *)(afStack_58 + uVar42 * 2) = CONCAT44(fVar94,fVar93);
        uVar42 = (ulong)((int)uVar42 + 1);
      }
    }
LAB_00a735f9:
    _local_528 = auVar76;
    auVar60 = _local_528;
    if ((int)uVar42 == 0) {
      fVar130 = *(float *)(ray + k * 4 + 0x80);
      auVar115._4_4_ = -(uint)(fStack_2e4 <= fVar130);
      auVar115._0_4_ = -(uint)(local_2e8 <= fVar130);
      auVar115._8_4_ = -(uint)(fStack_2e0 <= fVar130);
      auVar115._12_4_ = -(uint)(fStack_2dc <= fVar130);
      uVar46 = movmskps((int)pRVar39,auVar115);
      uVar44 = uVar44 & (uint)local_400 & uVar46;
      if (uVar44 == 0) {
        return;
      }
      goto LAB_00a7270f;
    }
    uVar49 = (int)uVar42 - 1;
    uVar38 = (ulong)uVar49;
    uVar48 = auStack_318[uVar38];
    fVar93 = afStack_58[uVar38 * 2];
    fVar94 = afStack_58[uVar38 * 2 + 1];
    uVar37 = 0;
    if (uVar48 != 0) {
      for (; (uVar48 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
      }
    }
    uVar48 = uVar48 - 1 & uVar48;
    auStack_318[uVar38] = uVar48;
    if (uVar48 == 0) {
      uVar42 = (ulong)uVar49;
    }
    fVar116 = (float)(uVar37 + 1) * 0.33333334;
    fVar137 = afStack_108[uVar38 * 2];
    fVar131 = afStack_108[uVar38 * 2 + 1];
    fVar95 = fVar137 * (1.0 - (float)uVar37 * 0.33333334) + fVar131 * (float)uVar37 * 0.33333334;
    fVar116 = fVar137 * (1.0 - fVar116) + fVar131 * fVar116;
    fVar135 = fVar137 * 0.0 + fVar131 * 0.0;
    fVar131 = fVar137 * 0.0 + fVar131 * 0.0;
    fVar137 = fVar116 - fVar95;
    if (fVar137 < 0.16666667) {
      fVar235 = 1.0 - fVar93;
      fVar249 = 1.0 - fVar93;
      fVar261 = 1.0 - fVar94;
      fVar263 = 1.0 - fVar94;
      fVar233 = fVar177 * fVar235 + fVar201 * fVar93;
      fVar246 = fVar178 * fVar249 + fVar202 * fVar93;
      fVar252 = fVar177 * fVar261 + fVar201 * fVar94;
      fVar255 = fVar178 * fVar263 + fVar202 * fVar94;
      fVar224 = fVar215 * fVar235 + fVar170 * fVar93;
      fVar225 = fVar216 * fVar249 + fVar171 * fVar93;
      fVar226 = fVar215 * fVar261 + fVar170 * fVar94;
      fVar232 = fVar216 * fVar263 + fVar171 * fVar94;
      fVar253 = fVar136 * fVar235 + fVar172 * fVar93;
      fVar256 = fVar176 * fVar249 + fVar152 * fVar93;
      fVar264 = fVar136 * fVar261 + fVar172 * fVar94;
      fVar267 = fVar176 * fVar263 + fVar152 * fVar94;
      fVar247 = (fVar235 * fVar203 + fVar93 * fVar51) - fVar253;
      fVar248 = (fVar249 * fVar214 + fVar93 * fVar52) - fVar256;
      fVar250 = (fVar261 * fVar203 + fVar94 * fVar51) - fVar264;
      fVar251 = (fVar263 * fVar214 + fVar94 * fVar52) - fVar267;
      fVar235 = fVar95 * (fVar253 - fVar224) + fVar224;
      fVar249 = fVar95 * (fVar256 - fVar225) + fVar225;
      fVar261 = fVar95 * (fVar264 - fVar226) + fVar226;
      fVar263 = fVar95 * (fVar267 - fVar232) + fVar232;
      fVar254 = (fVar253 - fVar224) * fVar116 + fVar224;
      fVar262 = (fVar256 - fVar225) * fVar116 + fVar225;
      fVar266 = (fVar264 - fVar226) * fVar116 + fVar226;
      fVar270 = (fVar267 - fVar232) * fVar116 + fVar232;
      fVar265 = fVar95 * (fVar224 - fVar233) + fVar233;
      fVar234 = fVar95 * (fVar225 - fVar246) + fVar246;
      fVar236 = fVar95 * (fVar226 - fVar252) + fVar252;
      fVar237 = fVar95 * (fVar232 - fVar255) + fVar255;
      auVar207._0_4_ = (fVar235 - fVar265) * fVar95 + fVar265;
      auVar207._4_4_ = (fVar249 - fVar234) * fVar95 + fVar234;
      auVar207._8_4_ = (fVar261 - fVar236) * fVar95 + fVar236;
      auVar207._12_4_ = (fVar263 - fVar237) * fVar95 + fVar237;
      fVar235 = (((fVar95 * fVar247 + fVar253) - fVar235) * fVar95 + fVar235) - auVar207._0_4_;
      fVar249 = (((fVar95 * fVar248 + fVar256) - fVar249) * fVar95 + fVar249) - auVar207._4_4_;
      fVar261 = (((fVar95 * fVar250 + fVar264) - fVar261) * fVar95 + fVar261) - auVar207._8_4_;
      fVar263 = (((fVar95 * fVar251 + fVar267) - fVar263) * fVar95 + fVar263) - auVar207._12_4_;
      fVar265 = fVar95 * fVar235 + auVar207._0_4_;
      fVar234 = fVar95 * fVar249 + auVar207._4_4_;
      fVar236 = fVar95 * fVar261 + auVar207._8_4_;
      fVar237 = fVar95 * fVar263 + auVar207._12_4_;
      fVar233 = (fVar224 - fVar233) * fVar116 + fVar233;
      fVar246 = (fVar225 - fVar246) * fVar116 + fVar246;
      fVar252 = (fVar226 - fVar252) * fVar116 + fVar252;
      fVar255 = (fVar232 - fVar255) * fVar116 + fVar255;
      fVar233 = (fVar254 - fVar233) * fVar116 + fVar233;
      fVar246 = (fVar262 - fVar246) * fVar116 + fVar246;
      fVar252 = (fVar266 - fVar252) * fVar116 + fVar252;
      fVar255 = (fVar270 - fVar255) * fVar116 + fVar255;
      fVar225 = (((fVar247 * fVar116 + fVar253) - fVar254) * fVar116 + fVar254) - fVar233;
      fVar226 = (((fVar248 * fVar116 + fVar256) - fVar262) * fVar116 + fVar262) - fVar246;
      fVar232 = (((fVar250 * fVar116 + fVar264) - fVar266) * fVar116 + fVar266) - fVar252;
      fVar262 = (((fVar251 * fVar116 + fVar267) - fVar270) * fVar116 + fVar270) - fVar255;
      fVar233 = fVar116 * fVar225 + fVar233;
      fVar246 = fVar116 * fVar226 + fVar246;
      fVar252 = fVar116 * fVar232 + fVar252;
      fVar255 = fVar116 * fVar262 + fVar255;
      fVar224 = fVar137 * 0.33333334;
      fVar247 = fVar235 * 3.0 * fVar224 + fVar265;
      fVar248 = fVar249 * 3.0 * fVar224 + fVar234;
      fVar250 = fVar261 * 3.0 * fVar224 + fVar236;
      fVar251 = fVar263 * 3.0 * fVar224 + fVar237;
      fVar253 = fVar233 - fVar224 * fVar225 * 3.0;
      fVar254 = fVar246 - fVar224 * fVar226 * 3.0;
      fVar256 = fVar252 - fVar224 * fVar232 * 3.0;
      fVar262 = fVar255 - fVar224 * fVar262 * 3.0;
      auVar13._4_8_ = auVar207._8_8_;
      auVar13._0_4_ = fVar246;
      auVar208._0_8_ = auVar13._0_8_ << 0x20;
      auVar208._8_4_ = fVar252;
      auVar208._12_4_ = fVar255;
      fVar235 = (fVar252 - fVar233) + (fVar236 - fVar265);
      fVar249 = (fVar255 - fVar246) + (fVar237 - fVar234);
      auVar219._0_4_ = fVar254 * fVar249;
      auVar219._4_4_ = fVar254 * fVar249;
      auVar219._8_4_ = fVar262 * fVar249;
      auVar219._12_4_ = fVar262 * fVar249;
      fVar224 = fVar265 * fVar235 + fVar234 * fVar249;
      fVar225 = fVar236 * fVar235 + fVar237 * fVar249;
      fVar261 = fVar247 * fVar235 + fVar248 * fVar249;
      fVar263 = fVar250 * fVar235 + fVar251 * fVar249;
      fVar264 = fVar253 * fVar235 + auVar219._0_4_;
      auVar195._0_8_ = CONCAT44(fVar254 * fVar235 + auVar219._4_4_,fVar264);
      auVar195._8_4_ = fVar256 * fVar235 + auVar219._8_4_;
      auVar195._12_4_ = fVar262 * fVar235 + auVar219._12_4_;
      fVar232 = fVar235 * fVar233 + fVar249 * fVar246;
      fVar266 = fVar235 * fVar252 + fVar249 * fVar255;
      auVar14._4_8_ = auVar219._8_8_;
      auVar14._0_4_ = fVar248 * fVar235 + fVar248 * fVar249;
      auVar220._0_8_ = auVar14._0_8_ << 0x20;
      auVar220._8_4_ = fVar263;
      auVar220._12_4_ = fVar251 * fVar235 + fVar251 * fVar249;
      fVar226 = fVar261;
      if (fVar261 <= fVar224) {
        fVar226 = fVar224;
        fVar224 = fVar261;
      }
      auVar221._8_8_ = auVar220._8_8_;
      auVar221._0_8_ = auVar221._8_8_;
      auVar79._8_4_ = auVar195._8_4_;
      auVar79._0_8_ = auVar195._0_8_;
      auVar79._12_4_ = auVar195._12_4_;
      if (fVar232 <= fVar264) {
        auVar79._0_4_ = fVar232;
      }
      if (auVar79._0_4_ <= fVar224) {
        fVar224 = auVar79._0_4_;
      }
      auVar15._4_8_ = auVar79._8_8_;
      auVar15._0_4_ = fVar235 * fVar246 + fVar249 * fVar246;
      auVar80._0_8_ = auVar15._0_8_ << 0x20;
      auVar80._8_4_ = fVar266;
      auVar80._12_4_ = fVar235 * fVar255 + fVar249 * fVar255;
      if (fVar232 <= fVar264) {
        fVar232 = fVar264;
      }
      auVar81._8_8_ = auVar80._8_8_;
      auVar81._0_8_ = auVar81._8_8_;
      if (fVar232 <= fVar226) {
        fVar232 = fVar226;
      }
      if (fVar263 <= fVar225) {
        auVar221._0_4_ = fVar225;
        fVar225 = fVar263;
      }
      auVar108._8_4_ = auVar195._8_4_;
      auVar108._0_8_ = auVar195._8_8_;
      auVar108._12_4_ = auVar195._12_4_;
      if (fVar266 <= auVar195._8_4_) {
        auVar108._0_4_ = fVar266;
      }
      if (auVar108._0_4_ <= fVar225) {
        fVar225 = auVar108._0_4_;
      }
      if (fVar266 <= auVar195._8_4_) {
        auVar81._0_4_ = auVar195._8_4_;
      }
      if (auVar81._0_4_ <= auVar221._0_4_) {
        auVar81._0_4_ = auVar221._0_4_;
      }
      bVar43 = 3 < (uint)uVar42;
      uVar16 = (undefined3)(uVar49 >> 8);
      fVar226 = auVar81._0_4_;
      if ((0.0001 <= fVar224) || (fVar226 <= -0.0001)) break;
      goto LAB_00a73955;
    }
  } while( true );
  if ((fVar225 < 0.0001 && -0.0001 < fVar232) ||
     ((fVar224 < 0.0001 && -0.0001 < fVar232 ||
      (pRVar39 = (RayHitK<4> *)(ulong)CONCAT31(uVar16,bVar43), auVar76 = _local_528,
      fVar225 < 0.0001 && -0.0001 < fVar226)))) {
LAB_00a73955:
    local_528 = (undefined1  [8])auVar208._8_8_;
    auVar76 = _local_528;
    bVar43 = bVar43 || fVar137 < 0.001;
    pRVar39 = (RayHitK<4> *)(ulong)CONCAT31(uVar16,bVar43);
    fVar249 = (float)(~-(uint)(fVar224 < 0.0) & 0x3f800000 | -(uint)(fVar224 < 0.0) & 0xbf800000);
    fVar261 = (float)(~-(uint)(fVar232 < 0.0) & 0x3f800000 | -(uint)(fVar232 < 0.0) & 0xbf800000);
    fVar235 = 0.0;
    if ((fVar249 == fVar261) && (!NAN(fVar249) && !NAN(fVar261))) {
      fVar235 = INFINITY;
    }
    fVar263 = 0.0;
    if ((fVar249 == fVar261) && (!NAN(fVar249) && !NAN(fVar261))) {
      fVar263 = -INFINITY;
    }
    fVar264 = (float)(~-(uint)(fVar225 < 0.0) & 0x3f800000 | -(uint)(fVar225 < 0.0) & 0xbf800000);
    if ((fVar249 != fVar264) || (NAN(fVar249) || NAN(fVar264))) {
      if ((fVar225 != fVar224) || (NAN(fVar225) || NAN(fVar224))) {
        fVar225 = -fVar224 / (fVar225 - fVar224);
        fVar225 = (1.0 - fVar225) * 0.0 + fVar225;
        auVar196 = ZEXT416((uint)fVar225);
      }
      else {
        fVar225 = 0.0;
        auVar196._0_12_ = ZEXT812(0x3f800000);
        auVar196._12_4_ = 0;
        if ((fVar224 != 0.0) || (NAN(fVar224))) {
          fVar225 = INFINITY;
          auVar196._0_12_ = ZEXT812(0xff800000);
          auVar196._12_4_ = 0;
        }
      }
      if (fVar225 <= fVar235) {
        fVar235 = fVar225;
      }
      if (auVar196._0_4_ <= fVar263) {
        auVar196._0_4_ = fVar263;
      }
      fVar263 = auVar196._0_4_;
    }
    fVar224 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar226 < 0.0) * 4);
    if ((fVar261 != fVar224) || (fVar225 = fVar263, NAN(fVar261) || NAN(fVar224))) {
      if ((fVar226 != fVar232) || (NAN(fVar226) || NAN(fVar232))) {
        fVar249 = -fVar232 / (fVar226 - fVar232);
        fVar249 = (1.0 - fVar249) * 0.0 + fVar249;
        fVar225 = fVar249;
      }
      else {
        fVar249 = 0.0;
        if ((fVar232 != 0.0) || (fVar225 = 1.0, NAN(fVar232))) {
          fVar249 = INFINITY;
          fVar225 = -INFINITY;
        }
      }
      if (fVar249 <= fVar235) {
        fVar235 = fVar249;
      }
      if (fVar225 <= fVar263) {
        fVar225 = fVar263;
      }
    }
    if ((fVar264 != fVar224) || (NAN(fVar264) || NAN(fVar224))) {
      fVar235 = (float)(~-(uint)(fVar235 < 1.0) & 0x3f800000 |
                       (uint)fVar235 & -(uint)(fVar235 < 1.0));
      fVar225 = (float)(~-(uint)(fVar225 < 1.0) & (uint)fVar225 |
                       -(uint)(fVar225 < 1.0) & 0x3f800000);
    }
    fVar235 = (float)(~-(uint)(fVar235 < 0.0) & (uint)fVar235);
    fVar224 = (float)(~-(uint)(fVar225 < 1.0) & 0x3f800000 | (uint)fVar225 & -(uint)(fVar225 < 1.0))
    ;
    fStack_520 = auVar60._8_4_;
    fStack_51c = auVar60._12_4_;
    if (fVar235 <= fVar224) {
      fVar235 = fVar235 + -0.1;
      fVar224 = fVar224 + 0.1;
      uVar48 = -(uint)(fVar224 < 1.0);
      fVar235 = (float)(~-(uint)(fVar235 < 0.0) & (uint)fVar235);
      fVar224 = (float)(~uVar48 & 0x3f800000 | (uint)fVar224 & uVar48);
      fVar264 = 1.0 - fVar235;
      fVar266 = 1.0 - fVar235;
      fVar267 = 1.0 - fVar224;
      fVar270 = 1.0 - fVar224;
      fVar225 = fVar265 * fVar264 + fVar236 * fVar235;
      fVar232 = fVar234 * fVar266 + fVar237 * fVar235;
      fVar249 = fVar265 * fVar267 + fVar236 * fVar224;
      fVar261 = fVar234 * fVar270 + fVar237 * fVar224;
      fVar263 = fVar247 * fVar264 + fVar250 * fVar235;
      fVar265 = fVar248 * fVar266 + fVar251 * fVar235;
      fVar234 = fVar247 * fVar267 + fVar250 * fVar224;
      fVar236 = fVar248 * fVar270 + fVar251 * fVar224;
      fVar237 = fVar253 * fVar264 + fVar256 * fVar235;
      fVar247 = fVar254 * fVar266 + fVar262 * fVar235;
      fVar248 = fVar253 * fVar267 + fVar256 * fVar224;
      fVar250 = fVar254 * fVar270 + fVar262 * fVar224;
      fVar252 = fVar264 * fVar233 + fVar252 * fVar235;
      fVar255 = fVar266 * fVar246 + fVar255 * fVar235;
      fVar233 = fVar267 * fVar233 + fStack_520 * fVar224;
      fVar246 = fVar270 * fVar246 + fStack_51c * fVar224;
      fVar251 = fVar93 * (1.0 - fVar224);
      fVar93 = fVar93 * (1.0 - fVar235) + fVar94 * fVar235;
      fVar94 = fVar251 + fVar94 * fVar224;
      fVar137 = 1.0 / fVar137;
      auVar109._0_4_ = fVar233 - fVar252;
      auVar109._4_4_ = fVar246 - fVar255;
      auVar109._8_4_ = fVar233 - fVar233;
      auVar109._12_4_ = fVar246 - fVar246;
      auVar133._0_8_ = CONCAT44(fVar250 - fVar247,fVar248 - fVar237);
      auVar133._8_4_ = fVar248 - fVar248;
      auVar133._12_4_ = fVar250 - fVar250;
      auVar165._0_4_ = fVar234 - fVar263;
      auVar165._4_4_ = fVar236 - fVar265;
      auVar165._8_4_ = fVar234 - fVar234;
      auVar165._12_4_ = fVar236 - fVar236;
      auVar222._0_8_ = CONCAT44((fVar265 - fVar232) * 3.0,(fVar263 - fVar225) * 3.0);
      auVar222._8_4_ = (fVar234 - fVar249) * 3.0;
      auVar222._12_4_ = (fVar236 - fVar261) * 3.0;
      auVar146._0_8_ = CONCAT44((fVar247 - fVar265) * 3.0,(fVar237 - fVar263) * 3.0);
      auVar146._8_4_ = (fVar248 - fVar234) * 3.0;
      auVar146._12_4_ = (fVar250 - fVar236) * 3.0;
      auVar242._0_4_ = (fVar252 - fVar237) * 3.0;
      auVar242._4_4_ = (fVar255 - fVar247) * 3.0;
      auVar242._8_4_ = (fVar233 - fVar248) * 3.0;
      auVar242._12_4_ = (fVar246 - fVar250) * 3.0;
      auVar197._8_4_ = auVar146._8_4_;
      auVar197._0_8_ = auVar146._0_8_;
      auVar197._12_4_ = auVar146._12_4_;
      auVar158 = minps(auVar197,auVar242);
      auVar60 = maxps(auVar146,auVar242);
      auVar228._8_4_ = auVar222._8_4_;
      auVar228._0_8_ = auVar222._0_8_;
      auVar228._12_4_ = auVar222._12_4_;
      auVar122 = minps(auVar228,auVar158);
      auVar159 = maxps(auVar222,auVar60);
      auVar17._4_8_ = auVar60._8_8_;
      auVar17._0_4_ = auVar122._4_4_;
      auVar147._0_8_ = auVar17._0_8_ << 0x20;
      auVar147._8_4_ = auVar122._8_4_;
      auVar147._12_4_ = auVar122._12_4_;
      auVar148._8_8_ = auVar122._8_8_;
      auVar148._0_8_ = auVar147._8_8_;
      auVar18._4_8_ = auVar158._8_8_;
      auVar18._0_4_ = auVar159._4_4_;
      auVar198._0_8_ = auVar18._0_8_ << 0x20;
      auVar198._8_4_ = auVar159._8_4_;
      auVar198._12_4_ = auVar159._12_4_;
      auVar199._8_8_ = auVar159._8_8_;
      auVar199._0_8_ = auVar198._8_8_;
      auVar158 = minps(auVar122,auVar148);
      auVar60 = maxps(auVar159,auVar199);
      fVar256 = auVar158._0_4_ * fVar137;
      fVar262 = auVar158._4_4_ * fVar137;
      fVar264 = auVar158._8_4_ * fVar137;
      fVar266 = auVar158._12_4_ * fVar137;
      fVar265 = fVar137 * auVar60._0_4_;
      fVar234 = fVar137 * auVar60._4_4_;
      fVar237 = fVar137 * auVar60._8_4_;
      fVar137 = fVar137 * auVar60._12_4_;
      fVar253 = 1.0 / (fVar94 - fVar93);
      auVar82._0_8_ = CONCAT44(fVar261 - fVar232,fVar249 - fVar225);
      auVar82._8_4_ = fVar249 - fVar249;
      auVar82._12_4_ = fVar261 - fVar261;
      auVar209._8_4_ = auVar82._8_4_;
      auVar209._0_8_ = auVar82._0_8_;
      auVar209._12_4_ = auVar82._12_4_;
      auVar159 = minps(auVar209,auVar165);
      auVar60 = maxps(auVar82,auVar165);
      auVar128._8_4_ = auVar133._8_4_;
      auVar128._0_8_ = auVar133._0_8_;
      auVar128._12_4_ = auVar133._12_4_;
      auVar158 = minps(auVar128,auVar109);
      auVar159 = minps(auVar159,auVar158);
      auVar158 = maxps(auVar133,auVar109);
      auVar60 = maxps(auVar60,auVar158);
      fVar250 = auVar159._0_4_ * fVar253;
      fVar251 = auVar159._4_4_ * fVar253;
      fVar254 = fVar253 * auVar60._0_4_;
      fVar253 = fVar253 * auVar60._4_4_;
      local_528._4_4_ = fVar93;
      local_528._0_4_ = fVar95;
      fStack_520 = fVar116;
      fStack_51c = fVar94;
      auVar200._4_4_ = fVar94;
      auVar200._0_4_ = fVar116;
      auVar200._8_4_ = fVar135;
      auVar200._12_4_ = fVar131;
      local_b8 = (fVar95 + fVar116) * 0.5;
      fVar255 = (fVar93 + fVar94) * 0.5;
      fVar261 = (fVar116 + fVar135) * 0.0;
      fVar263 = (fVar94 + fVar131) * 0.0;
      fVar224 = local_138 * local_b8 + fVar177;
      fVar225 = fStack_134 * local_b8 + fVar178;
      fVar232 = fStack_130 * local_b8 + fVar130;
      fVar233 = fStack_12c * local_b8 + 0.0;
      fVar235 = local_148 * local_b8 + local_328;
      fVar246 = fStack_144 * local_b8 + fStack_324;
      fVar249 = fStack_140 * local_b8 + (float)uStack_320;
      fVar252 = fStack_13c * local_b8 + uStack_320._4_4_;
      fVar224 = (fVar235 - fVar224) * local_b8 + fVar224;
      fVar225 = (fVar246 - fVar225) * local_b8 + fVar225;
      fVar232 = (fVar249 - fVar232) * local_b8 + fVar232;
      fVar233 = (fVar252 - fVar233) * local_b8 + fVar233;
      fVar235 = (((local_158 * local_b8 + (float)local_338) - fVar235) * local_b8 + fVar235) -
                fVar224;
      fVar246 = (((fStack_154 * local_b8 + local_338._4_4_) - fVar246) * local_b8 + fVar246) -
                fVar225;
      fVar249 = (((fStack_150 * local_b8 + fStack_330) - fVar249) * local_b8 + fVar249) - fVar232;
      fVar252 = (((fStack_14c * local_b8 + fStack_32c) - fVar252) * local_b8 + fVar252) - fVar233;
      fVar224 = local_b8 * fVar235 + fVar224;
      fVar225 = local_b8 * fVar246 + fVar225;
      fVar235 = fVar235 * 3.0;
      fVar246 = fVar246 * 3.0;
      fVar232 = (local_b8 * fVar249 + fVar232) - fVar224;
      fVar233 = (local_b8 * fVar252 + fVar233) - fVar225;
      fVar235 = (fVar249 * 3.0 - fVar235) * fVar255 + fVar235;
      fVar246 = (fVar252 * 3.0 - fVar246) * fVar255 + fVar246;
      auVar134._0_8_ = CONCAT44(fVar235,fVar232) ^ 0x80000000;
      auVar134._8_4_ = fVar235;
      auVar134._12_4_ = fVar235;
      fVar267 = fVar95 - local_b8;
      fVar270 = fVar93 - fVar255;
      fVar271 = fVar116 - fVar261;
      fVar272 = fVar94 - fVar263;
      fVar273 = fVar116 - local_b8;
      fVar277 = fVar94 - fVar255;
      fVar135 = fVar135 - fVar261;
      fVar131 = fVar131 - fVar263;
      fVar224 = fVar232 * fVar255 + fVar224;
      fVar225 = fVar233 * fVar255 + fVar225;
      auVar149._0_8_ = CONCAT44(fVar246,fVar233) ^ 0x8000000000000000;
      auVar149._8_4_ = -fVar246;
      auVar149._12_4_ = -fVar246;
      auVar83._0_4_ = fVar233 * fVar235 - fVar246 * fVar232;
      auVar83._4_4_ = auVar83._0_4_;
      auVar83._8_4_ = auVar83._0_4_;
      auVar83._12_4_ = auVar83._0_4_;
      auVar158 = divps(auVar149,auVar83);
      auVar60 = divps(auVar134,auVar83);
      fVar252 = auVar158._0_4_;
      fVar261 = auVar158._4_4_;
      fVar246 = auVar60._0_4_;
      fVar249 = auVar60._4_4_;
      local_b8 = local_b8 - (fVar225 * fVar246 + fVar224 * fVar252);
      local_a8 = fVar255 - (fVar225 * fVar249 + fVar224 * fVar261);
      fVar235 = fVar255 - (fVar225 * auVar60._8_4_ + fVar224 * auVar158._8_4_);
      fVar255 = fVar255 - (fVar225 * auVar60._12_4_ + fVar224 * auVar158._12_4_);
      auVar110._0_8_ = CONCAT44(fVar261 * fVar250,fVar261 * fVar256);
      auVar110._8_4_ = fVar261 * fVar262;
      auVar110._12_4_ = fVar261 * fVar251;
      auVar84._0_4_ = fVar261 * fVar265;
      auVar84._4_4_ = fVar261 * fVar254;
      auVar84._8_4_ = fVar261 * fVar234;
      auVar84._12_4_ = fVar261 * fVar253;
      auVar279._8_4_ = auVar110._8_4_;
      auVar279._0_8_ = auVar110._0_8_;
      auVar279._12_4_ = auVar110._12_4_;
      auVar122 = minps(auVar279,auVar84);
      auVar60 = maxps(auVar84,auVar110);
      auVar166._0_8_ = CONCAT44(fVar249 * fVar251,fVar249 * fVar262);
      auVar166._8_4_ = fVar249 * fVar264;
      auVar166._12_4_ = fVar249 * fVar266;
      auVar111._0_4_ = fVar249 * fVar234;
      auVar111._4_4_ = fVar249 * fVar253;
      auVar111._8_4_ = fVar249 * fVar237;
      auVar111._12_4_ = fVar249 * fVar137;
      auVar229._8_4_ = auVar166._8_4_;
      auVar229._0_8_ = auVar166._0_8_;
      auVar229._12_4_ = auVar166._12_4_;
      auVar159 = minps(auVar229,auVar111);
      auVar158 = maxps(auVar111,auVar166);
      fVar224 = 0.0 - (auVar158._0_4_ + auVar60._0_4_);
      fVar225 = 1.0 - (auVar158._4_4_ + auVar60._4_4_);
      fVar232 = 0.0 - (auVar158._8_4_ + auVar60._8_4_);
      fVar233 = 0.0 - (auVar158._12_4_ + auVar60._12_4_);
      fVar263 = 0.0 - (auVar159._0_4_ + auVar122._0_4_);
      fVar236 = 1.0 - (auVar159._4_4_ + auVar122._4_4_);
      fVar247 = 0.0 - (auVar159._8_4_ + auVar122._8_4_);
      fVar248 = 0.0 - (auVar159._12_4_ + auVar122._12_4_);
      auVar112._0_8_ = CONCAT44(fVar270 * fVar225,fVar267 * fVar224);
      auVar112._8_4_ = fVar271 * fVar232;
      auVar112._12_4_ = fVar272 * fVar233;
      auVar243._0_8_ = CONCAT44(fVar250 * fVar252,fVar256 * fVar252);
      auVar243._8_4_ = fVar262 * fVar252;
      auVar243._12_4_ = fVar251 * fVar252;
      auVar167._0_4_ = fVar252 * fVar265;
      auVar167._4_4_ = fVar252 * fVar254;
      auVar167._8_4_ = fVar252 * fVar234;
      auVar167._12_4_ = fVar252 * fVar253;
      auVar230._8_4_ = auVar243._8_4_;
      auVar230._0_8_ = auVar243._0_8_;
      auVar230._12_4_ = auVar243._12_4_;
      auVar158 = minps(auVar230,auVar167);
      auVar60 = maxps(auVar167,auVar243);
      auVar210._0_8_ = CONCAT44(fVar251 * fVar246,fVar262 * fVar246);
      auVar210._8_4_ = fVar264 * fVar246;
      auVar210._12_4_ = fVar266 * fVar246;
      auVar244._0_4_ = fVar246 * fVar234;
      auVar244._4_4_ = fVar246 * fVar253;
      auVar244._8_4_ = fVar246 * fVar237;
      auVar244._12_4_ = fVar246 * fVar137;
      auVar276._8_4_ = auVar210._8_4_;
      auVar276._0_8_ = auVar210._0_8_;
      auVar276._12_4_ = auVar210._12_4_;
      auVar122 = minps(auVar276,auVar244);
      auVar231._0_4_ = fVar267 * fVar263;
      auVar231._4_4_ = fVar270 * fVar236;
      auVar231._8_4_ = fVar271 * fVar247;
      auVar231._12_4_ = fVar272 * fVar248;
      auVar85._0_8_ = CONCAT44(fVar225 * fVar277,fVar224 * fVar273);
      auVar85._8_4_ = fVar232 * fVar135;
      auVar85._12_4_ = fVar233 * fVar131;
      auVar175._0_4_ = fVar263 * fVar273;
      auVar175._4_4_ = fVar236 * fVar277;
      auVar175._8_4_ = fVar247 * fVar135;
      auVar175._12_4_ = fVar248 * fVar131;
      auVar159 = maxps(auVar244,auVar210);
      fVar137 = 1.0 - (auVar159._0_4_ + auVar60._0_4_);
      fVar224 = 0.0 - (auVar159._4_4_ + auVar60._4_4_);
      fVar225 = 0.0 - (auVar159._8_4_ + auVar60._8_4_);
      fVar232 = 0.0 - (auVar159._12_4_ + auVar60._12_4_);
      fVar233 = 1.0 - (auVar122._0_4_ + auVar158._0_4_);
      fVar263 = 0.0 - (auVar122._4_4_ + auVar158._4_4_);
      fVar265 = 0.0 - (auVar122._8_4_ + auVar158._8_4_);
      fVar234 = 0.0 - (auVar122._12_4_ + auVar158._12_4_);
      auVar211._0_8_ = CONCAT44(fVar270 * fVar224,fVar267 * fVar137);
      auVar211._8_4_ = fVar271 * fVar225;
      auVar211._12_4_ = fVar272 * fVar232;
      auVar260._0_4_ = fVar267 * fVar233;
      auVar260._4_4_ = fVar270 * fVar263;
      auVar260._8_4_ = fVar271 * fVar265;
      auVar260._12_4_ = fVar272 * fVar234;
      auVar168._0_8_ = CONCAT44(fVar224 * fVar277,fVar137 * fVar273);
      auVar168._8_4_ = fVar225 * fVar135;
      auVar168._12_4_ = fVar232 * fVar131;
      auVar223._0_4_ = fVar233 * fVar273;
      auVar223._4_4_ = fVar263 * fVar277;
      auVar223._8_4_ = fVar265 * fVar135;
      auVar223._12_4_ = fVar234 * fVar131;
      auVar245._8_4_ = auVar211._8_4_;
      auVar245._0_8_ = auVar211._0_8_;
      auVar245._12_4_ = auVar211._12_4_;
      auVar60 = minps(auVar245,auVar260);
      auVar269._8_4_ = auVar168._8_4_;
      auVar269._0_8_ = auVar168._0_8_;
      auVar269._12_4_ = auVar168._12_4_;
      auVar158 = minps(auVar269,auVar223);
      auVar218 = minps(auVar60,auVar158);
      auVar158 = maxps(auVar260,auVar211);
      auVar60 = maxps(auVar223,auVar168);
      auVar159 = maxps(auVar60,auVar158);
      auVar212._8_4_ = auVar112._8_4_;
      auVar212._0_8_ = auVar112._0_8_;
      auVar212._12_4_ = auVar112._12_4_;
      auVar158 = minps(auVar212,auVar231);
      auVar169._8_4_ = auVar85._8_4_;
      auVar169._0_8_ = auVar85._0_8_;
      auVar169._12_4_ = auVar85._12_4_;
      auVar60 = minps(auVar169,auVar175);
      auVar158 = minps(auVar158,auVar60);
      auVar122 = maxps(auVar231,auVar112);
      auVar60 = maxps(auVar175,auVar85);
      auVar60 = maxps(auVar60,auVar122);
      auVar213._0_4_ = auVar218._4_4_ + auVar218._0_4_ + local_b8;
      auVar213._4_4_ = auVar158._4_4_ + auVar158._0_4_ + local_a8;
      auVar213._8_4_ = auVar218._8_4_ + auVar218._4_4_ + fVar235;
      auVar213._12_4_ = auVar218._12_4_ + auVar158._4_4_ + fVar255;
      fVar137 = auVar159._4_4_ + auVar159._0_4_ + local_b8;
      fVar131 = auVar60._4_4_ + auVar60._0_4_ + local_a8;
      auVar86._4_4_ = fVar131;
      auVar86._0_4_ = fVar137;
      auVar158 = maxps(_local_528,auVar213);
      auVar86._8_4_ = auVar159._8_4_ + auVar159._4_4_ + fVar235;
      auVar86._12_4_ = auVar159._12_4_ + auVar60._4_4_ + fVar255;
      auVar60 = minps(auVar86,auVar200);
      iVar45 = -(uint)(auVar60._0_4_ < auVar158._0_4_);
      iVar47 = -(uint)(auVar60._4_4_ < auVar158._4_4_);
      auVar88._4_4_ = iVar47;
      auVar88._0_4_ = iVar45;
      auVar88._8_4_ = iVar47;
      auVar88._12_4_ = iVar47;
      auVar87._8_8_ = auVar88._8_8_;
      auVar87._4_4_ = iVar45;
      auVar87._0_4_ = iVar45;
      iVar45 = movmskpd((uint)(fVar226 < 0.0),auVar87);
      auVar76 = _local_528;
      if (iVar45 == 0) {
        bVar36 = 0;
        if ((fVar95 < auVar213._0_4_) && (fVar137 < fVar116)) {
          bVar36 = -(fVar131 < fVar94) & fVar93 < auVar213._4_4_;
        }
        bVar36 = bVar43 | bVar36;
        uVar38 = (ulong)CONCAT31(uVar16,bVar36);
        if (bVar36 != 1) goto LAB_00a72f94;
        pRVar39 = (RayHitK<4> *)&DAT_000000c8;
        do {
          fVar93 = 1.0 - local_b8;
          fVar137 = local_b8 * local_b8 * local_b8;
          fVar116 = local_b8 * local_b8 * 3.0 * fVar93;
          fVar94 = fVar93 * fVar93 * fVar93;
          fVar131 = local_b8 * 3.0 * fVar93 * fVar93;
          fVar95 = fVar94 * fVar177 +
                   fVar131 * local_328 +
                   fVar116 * (float)local_338 + fVar137 * (float)local_118._0_4_;
          fVar93 = fVar94 * fVar178 +
                   fVar131 * fStack_324 +
                   fVar116 * local_338._4_4_ + fVar137 * (float)local_118._4_4_;
          fVar95 = ((fVar94 * fVar130 +
                    fVar131 * (float)uStack_320 + fVar116 * fStack_330 + fVar137 * fStack_110) -
                   fVar95) * local_a8 + fVar95;
          fVar93 = ((fVar94 * 0.0 +
                    fVar131 * uStack_320._4_4_ + fVar116 * fStack_32c + fVar137 * fStack_10c) -
                   fVar93) * local_a8 + fVar93;
          local_b8 = local_b8 - (fVar93 * fVar246 + fVar95 * fVar252);
          local_a8 = local_a8 - (fVar93 * fVar249 + fVar95 * fVar261);
          fVar95 = (float)((uint)fVar95 & (uint)DAT_01f7b6c0);
          fVar93 = (float)((uint)fVar93 & DAT_01f7b6c0._4_4_);
          if (fVar93 <= fVar95) {
            fVar93 = fVar95;
          }
          if (fVar93 < local_128) {
            if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) && (0.0 <= local_a8)) && (local_a8 <= 1.0)
               ) {
              fVar93 = pre->ray_space[k].vx.field_0.m128[2];
              fVar94 = pre->ray_space[k].vy.field_0.m128[2];
              fVar95 = pre->ray_space[k].vz.field_0.m128[2];
              fVar225 = 1.0 - local_a8;
              fVar224 = 1.0 - local_b8;
              fVar116 = fVar224 * fVar224 * fVar224;
              fVar137 = local_b8 * 3.0 * fVar224 * fVar224;
              fVar135 = local_b8 * local_b8 * local_b8;
              fVar131 = local_b8 * local_b8 * 3.0 * fVar224;
              fVar93 = ((fStack_160 * fVar95 + fStack_164 * fVar94 + local_168 * fVar93) * fVar225 +
                       (fStack_1a0 * fVar95 + fStack_1a4 * fVar94 + local_1a8 * fVar93) * local_a8)
                       * fVar116 +
                       ((fStack_170 * fVar95 + fStack_174 * fVar94 + local_178 * fVar93) * fVar225 +
                       (fStack_1b0 * fVar95 + fStack_1b4 * fVar94 + local_1b8 * fVar93) * local_a8)
                       * fVar137 +
                       ((fStack_180 * fVar95 + fStack_184 * fVar94 + local_188 * fVar93) * fVar225 +
                       (fStack_1c0 * fVar95 + fStack_1c4 * fVar94 + local_1c8 * fVar93) * local_a8)
                       * fVar131 +
                       (fVar225 * (fStack_190 * fVar95 + fStack_194 * fVar94 + local_198 * fVar93) +
                       (fVar95 * fStack_1d0 + fVar94 * fStack_1d4 + fVar93 * local_1d8) * local_a8)
                       * fVar135;
              if ((fVar92 <= fVar93) &&
                 (fVar94 = *(float *)(ray + k * 4 + 0x80), pRVar39 = ray, fVar93 <= fVar94)) {
                fVar232 = 1.0 - local_a8;
                fVar233 = 1.0 - local_a8;
                fVar235 = 1.0 - local_a8;
                fVar95 = local_3a8 * fVar232 + local_298 * local_a8;
                fVar225 = fStack_3a4 * fVar233 + fStack_294 * local_a8;
                fVar226 = fStack_3a0 * fVar235 + fStack_290 * local_a8;
                fVar246 = local_3c8 * fVar232 + fVar150 * local_a8;
                fVar252 = fStack_3c4 * fVar233 + fVar151 * local_a8;
                fVar261 = fStack_3c0 * fVar235 + fVar96 * local_a8;
                fVar249 = fVar246 - fVar95;
                fVar255 = fVar252 - fVar225;
                fVar263 = fVar261 - fVar226;
                fVar95 = (((fVar95 - (local_398 * fVar232 + local_388 * local_a8)) * fVar224 +
                          local_b8 * fVar249) * fVar224 +
                         (fVar249 * fVar224 +
                         ((fVar232 * local_3b8 + fVar117 * local_a8) - fVar246) * local_b8) *
                         local_b8) * 3.0;
                fVar225 = (((fVar225 - (fStack_394 * fVar233 + fStack_384 * local_a8)) * fVar224 +
                           local_b8 * fVar255) * fVar224 +
                          (fVar255 * fVar224 +
                          ((fVar233 * fStack_3b4 + fVar118 * local_a8) - fVar252) * local_b8) *
                          local_b8) * 3.0;
                fVar224 = (((fVar226 - (fStack_390 * fVar235 + fStack_380 * local_a8)) * fVar224 +
                           local_b8 * fVar263) * fVar224 +
                          (fVar263 * fVar224 +
                          ((fVar235 * fStack_3b0 + fVar129 * local_a8) - fVar261) * local_b8) *
                          local_b8) * 3.0;
                pGVar7 = (context->scene->geometries).items[uVar46].ptr;
                pRVar39 = (RayHitK<4> *)(ulong)*(uint *)(ray + k * 4 + 0x90);
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar226 = fVar116 * local_2a8 +
                            fVar137 * local_2b8 + fVar131 * local_2c8 + fVar135 * local_2d8;
                  fVar232 = fVar116 * fStack_2a4 +
                            fVar137 * fStack_2b4 + fVar131 * fStack_2c4 + fVar135 * fStack_2d4;
                  fVar116 = fVar116 * fStack_2a0 +
                            fVar137 * fStack_2b0 + fVar131 * fStack_2c0 + fVar135 * fStack_2d0;
                  local_c8 = fVar232 * fVar95 - fVar225 * fVar226;
                  local_e8 = fVar116 * fVar225 - fVar224 * fVar232;
                  local_d8 = fVar226 * fVar224 - fVar95 * fVar116;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar93;
                    *(float *)(ray + k * 4 + 0xc0) = local_e8;
                    *(float *)(ray + k * 4 + 0xd0) = local_d8;
                    *(float *)(ray + k * 4 + 0xe0) = local_c8;
                    *(float *)(ray + k * 4 + 0xf0) = local_b8;
                    *(float *)(ray + k * 4 + 0x100) = local_a8;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_408;
                    *(uint *)(ray + k * 4 + 0x120) = uVar46;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar48 = context->user->instPrimID[0];
                    *(uint *)(ray + k * 4 + 0x140) = uVar48;
                    pRVar39 = (RayHitK<4> *)(ulong)uVar48;
                  }
                  else {
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    fStack_c4 = local_c8;
                    fStack_c0 = local_c8;
                    fStack_bc = local_c8;
                    fStack_b4 = local_b8;
                    fStack_b0 = local_b8;
                    fStack_ac = local_b8;
                    fStack_a4 = local_a8;
                    fStack_a0 = local_a8;
                    fStack_9c = local_a8;
                    local_98 = CONCAT44(uStack_304,local_308);
                    uStack_90 = CONCAT44(uStack_2fc,uStack_300);
                    local_88 = CONCAT44(uStack_2f4,local_2f8);
                    uStack_80 = CONCAT44(uStack_2ec,uStack_2f0);
                    local_78 = context->user->instID[0];
                    uStack_74 = local_78;
                    uStack_70 = local_78;
                    uStack_6c = local_78;
                    local_68 = context->user->instPrimID[0];
                    uStack_64 = local_68;
                    uStack_60 = local_68;
                    uStack_5c = local_68;
                    *(float *)(ray + k * 4 + 0x80) = fVar93;
                    local_428 = *local_418;
                    local_3f8.valid = (int *)local_428;
                    local_3f8.geometryUserPtr = pGVar7->userPtr;
                    local_3f8.context = context->user;
                    local_3f8.hit = (RTCHitN *)&local_e8;
                    local_3f8.N = 4;
                    p_Var40 = pGVar7->intersectionFilterN;
                    local_3f8.ray = (RTCRayN *)ray;
                    if (p_Var40 != (RTCFilterFunctionN)0x0) {
                      p_Var40 = (RTCFilterFunctionN)(*p_Var40)(&local_3f8);
                    }
                    auVar113._0_4_ = -(uint)(local_428._0_4_ == 0);
                    auVar113._4_4_ = -(uint)(local_428._4_4_ == 0);
                    auVar113._8_4_ = -(uint)(local_428._8_4_ == 0);
                    auVar113._12_4_ = -(uint)(local_428._12_4_ == 0);
                    uVar48 = movmskps((int)p_Var40,auVar113);
                    pRVar39 = (RayHitK<4> *)(ulong)(uVar48 ^ 0xf);
                    if ((uVar48 ^ 0xf) == 0) {
                      auVar113 = auVar113 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var40 = context->args->filter;
                      if ((p_Var40 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        p_Var40 = (RTCFilterFunctionN)(*p_Var40)(&local_3f8);
                      }
                      auVar89._0_4_ = -(uint)(local_428._0_4_ == 0);
                      auVar89._4_4_ = -(uint)(local_428._4_4_ == 0);
                      auVar89._8_4_ = -(uint)(local_428._8_4_ == 0);
                      auVar89._12_4_ = -(uint)(local_428._12_4_ == 0);
                      auVar113 = auVar89 ^ _DAT_01f7ae20;
                      uVar48 = movmskps((int)p_Var40,auVar89);
                      pRVar39 = (RayHitK<4> *)(ulong)(uVar48 ^ 0xf);
                      if ((uVar48 ^ 0xf) != 0) {
                        fVar93 = *(float *)(local_3f8.hit + 4);
                        fVar95 = *(float *)(local_3f8.hit + 8);
                        fVar116 = *(float *)(local_3f8.hit + 0xc);
                        *(uint *)(local_3f8.ray + 0xc0) =
                             ~auVar89._0_4_ & (uint)*(float *)local_3f8.hit |
                             *(uint *)(local_3f8.ray + 0xc0) & auVar89._0_4_;
                        *(uint *)(local_3f8.ray + 0xc4) =
                             ~auVar89._4_4_ & (uint)fVar93 |
                             *(uint *)(local_3f8.ray + 0xc4) & auVar89._4_4_;
                        *(uint *)(local_3f8.ray + 200) =
                             ~auVar89._8_4_ & (uint)fVar95 |
                             *(uint *)(local_3f8.ray + 200) & auVar89._8_4_;
                        *(uint *)(local_3f8.ray + 0xcc) =
                             ~auVar89._12_4_ & (uint)fVar116 |
                             *(uint *)(local_3f8.ray + 0xcc) & auVar89._12_4_;
                        fVar93 = *(float *)(local_3f8.hit + 0x14);
                        fVar95 = *(float *)(local_3f8.hit + 0x18);
                        fVar116 = *(float *)(local_3f8.hit + 0x1c);
                        *(uint *)(local_3f8.ray + 0xd0) =
                             ~auVar89._0_4_ & (uint)*(float *)(local_3f8.hit + 0x10) |
                             *(uint *)(local_3f8.ray + 0xd0) & auVar89._0_4_;
                        *(uint *)(local_3f8.ray + 0xd4) =
                             ~auVar89._4_4_ & (uint)fVar93 |
                             *(uint *)(local_3f8.ray + 0xd4) & auVar89._4_4_;
                        *(uint *)(local_3f8.ray + 0xd8) =
                             ~auVar89._8_4_ & (uint)fVar95 |
                             *(uint *)(local_3f8.ray + 0xd8) & auVar89._8_4_;
                        *(uint *)(local_3f8.ray + 0xdc) =
                             ~auVar89._12_4_ & (uint)fVar116 |
                             *(uint *)(local_3f8.ray + 0xdc) & auVar89._12_4_;
                        fVar93 = *(float *)(local_3f8.hit + 0x24);
                        fVar95 = *(float *)(local_3f8.hit + 0x28);
                        fVar116 = *(float *)(local_3f8.hit + 0x2c);
                        *(uint *)(local_3f8.ray + 0xe0) =
                             ~auVar89._0_4_ & (uint)*(float *)(local_3f8.hit + 0x20) |
                             *(uint *)(local_3f8.ray + 0xe0) & auVar89._0_4_;
                        *(uint *)(local_3f8.ray + 0xe4) =
                             ~auVar89._4_4_ & (uint)fVar93 |
                             *(uint *)(local_3f8.ray + 0xe4) & auVar89._4_4_;
                        *(uint *)(local_3f8.ray + 0xe8) =
                             ~auVar89._8_4_ & (uint)fVar95 |
                             *(uint *)(local_3f8.ray + 0xe8) & auVar89._8_4_;
                        *(uint *)(local_3f8.ray + 0xec) =
                             ~auVar89._12_4_ & (uint)fVar116 |
                             *(uint *)(local_3f8.ray + 0xec) & auVar89._12_4_;
                        fVar93 = *(float *)(local_3f8.hit + 0x34);
                        fVar95 = *(float *)(local_3f8.hit + 0x38);
                        fVar116 = *(float *)(local_3f8.hit + 0x3c);
                        *(uint *)(local_3f8.ray + 0xf0) =
                             ~auVar89._0_4_ & (uint)*(float *)(local_3f8.hit + 0x30) |
                             *(uint *)(local_3f8.ray + 0xf0) & auVar89._0_4_;
                        *(uint *)(local_3f8.ray + 0xf4) =
                             ~auVar89._4_4_ & (uint)fVar93 |
                             *(uint *)(local_3f8.ray + 0xf4) & auVar89._4_4_;
                        *(uint *)(local_3f8.ray + 0xf8) =
                             ~auVar89._8_4_ & (uint)fVar95 |
                             *(uint *)(local_3f8.ray + 0xf8) & auVar89._8_4_;
                        *(uint *)(local_3f8.ray + 0xfc) =
                             ~auVar89._12_4_ & (uint)fVar116 |
                             *(uint *)(local_3f8.ray + 0xfc) & auVar89._12_4_;
                        fVar93 = *(float *)(local_3f8.hit + 0x44);
                        fVar95 = *(float *)(local_3f8.hit + 0x48);
                        fVar116 = *(float *)(local_3f8.hit + 0x4c);
                        *(uint *)(local_3f8.ray + 0x100) =
                             ~auVar89._0_4_ & (uint)*(float *)(local_3f8.hit + 0x40) |
                             *(uint *)(local_3f8.ray + 0x100) & auVar89._0_4_;
                        *(uint *)(local_3f8.ray + 0x104) =
                             ~auVar89._4_4_ & (uint)fVar93 |
                             *(uint *)(local_3f8.ray + 0x104) & auVar89._4_4_;
                        *(uint *)(local_3f8.ray + 0x108) =
                             ~auVar89._8_4_ & (uint)fVar95 |
                             *(uint *)(local_3f8.ray + 0x108) & auVar89._8_4_;
                        *(uint *)(local_3f8.ray + 0x10c) =
                             ~auVar89._12_4_ & (uint)fVar116 |
                             *(uint *)(local_3f8.ray + 0x10c) & auVar89._12_4_;
                        fVar93 = *(float *)(local_3f8.hit + 0x54);
                        fVar95 = *(float *)(local_3f8.hit + 0x58);
                        fVar116 = *(float *)(local_3f8.hit + 0x5c);
                        *(uint *)(local_3f8.ray + 0x110) =
                             *(uint *)(local_3f8.ray + 0x110) & auVar89._0_4_ |
                             ~auVar89._0_4_ & (uint)*(float *)(local_3f8.hit + 0x50);
                        *(uint *)(local_3f8.ray + 0x114) =
                             *(uint *)(local_3f8.ray + 0x114) & auVar89._4_4_ |
                             ~auVar89._4_4_ & (uint)fVar93;
                        *(uint *)(local_3f8.ray + 0x118) =
                             *(uint *)(local_3f8.ray + 0x118) & auVar89._8_4_ |
                             ~auVar89._8_4_ & (uint)fVar95;
                        *(uint *)(local_3f8.ray + 0x11c) =
                             *(uint *)(local_3f8.ray + 0x11c) & auVar89._12_4_ |
                             ~auVar89._12_4_ & (uint)fVar116;
                        fVar93 = *(float *)(local_3f8.hit + 100);
                        fVar95 = *(float *)(local_3f8.hit + 0x68);
                        fVar116 = *(float *)(local_3f8.hit + 0x6c);
                        *(uint *)(local_3f8.ray + 0x120) =
                             *(uint *)(local_3f8.ray + 0x120) & auVar89._0_4_ |
                             ~auVar89._0_4_ & (uint)*(float *)(local_3f8.hit + 0x60);
                        *(uint *)(local_3f8.ray + 0x124) =
                             *(uint *)(local_3f8.ray + 0x124) & auVar89._4_4_ |
                             ~auVar89._4_4_ & (uint)fVar93;
                        *(uint *)(local_3f8.ray + 0x128) =
                             *(uint *)(local_3f8.ray + 0x128) & auVar89._8_4_ |
                             ~auVar89._8_4_ & (uint)fVar95;
                        *(uint *)(local_3f8.ray + 300) =
                             *(uint *)(local_3f8.ray + 300) & auVar89._12_4_ |
                             ~auVar89._12_4_ & (uint)fVar116;
                        fVar93 = *(float *)(local_3f8.hit + 0x74);
                        fVar95 = *(float *)(local_3f8.hit + 0x78);
                        fVar116 = *(float *)(local_3f8.hit + 0x7c);
                        *(uint *)(local_3f8.ray + 0x130) =
                             ~auVar89._0_4_ & (uint)*(float *)(local_3f8.hit + 0x70) |
                             *(uint *)(local_3f8.ray + 0x130) & auVar89._0_4_;
                        *(uint *)(local_3f8.ray + 0x134) =
                             ~auVar89._4_4_ & (uint)fVar93 |
                             *(uint *)(local_3f8.ray + 0x134) & auVar89._4_4_;
                        *(uint *)(local_3f8.ray + 0x138) =
                             ~auVar89._8_4_ & (uint)fVar95 |
                             *(uint *)(local_3f8.ray + 0x138) & auVar89._8_4_;
                        *(uint *)(local_3f8.ray + 0x13c) =
                             ~auVar89._12_4_ & (uint)fVar116 |
                             *(uint *)(local_3f8.ray + 0x13c) & auVar89._12_4_;
                        *(undefined1 (*) [16])(local_3f8.ray + 0x140) =
                             ~auVar89 & *(undefined1 (*) [16])(local_3f8.hit + 0x80) |
                             *(undefined1 (*) [16])(local_3f8.ray + 0x140) & auVar89;
                        pRVar39 = (RayHitK<4> *)local_3f8.ray;
                      }
                    }
                    auVar114._0_4_ = auVar113._0_4_ << 0x1f;
                    auVar114._4_4_ = auVar113._4_4_ << 0x1f;
                    auVar114._8_4_ = auVar113._8_4_ << 0x1f;
                    auVar114._12_4_ = auVar113._12_4_ << 0x1f;
                    uVar48 = movmskps((int)pRVar39,auVar114);
                    pRVar39 = (RayHitK<4> *)(ulong)uVar48;
                    if (uVar48 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar94;
                      pRVar39 = ray;
                    }
                  }
                }
              }
            }
            break;
          }
          pRVar39 = pRVar39 + -1;
        } while (pRVar39 != (RayHitK<4> *)0x0);
      }
    }
  }
  goto LAB_00a735f9;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }